

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  ulong uVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  byte bVar57;
  int iVar58;
  uint uVar59;
  uint uVar60;
  ulong uVar61;
  long lVar62;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar63;
  byte bVar64;
  ulong uVar65;
  undefined4 uVar66;
  undefined8 in_R11;
  ulong uVar67;
  bool bVar68;
  float fVar69;
  undefined8 uVar70;
  float fVar96;
  vint4 bi_2;
  undefined1 auVar71 [16];
  float fVar95;
  float fVar97;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar75 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar98;
  float fVar126;
  float fVar127;
  vint4 bi_1;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  vint4 ai_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar172;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vint4 ai;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar173 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 bi;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [28];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar205;
  float fVar206;
  vint4 ai_1;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar211 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar212 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar239 [32];
  undefined1 auVar256 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  float fVar238;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar242 [64];
  float fVar250;
  undefined1 auVar246 [16];
  float fVar251;
  undefined1 auVar248 [32];
  undefined1 auVar247 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar249 [64];
  undefined1 auVar255 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar261;
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_ce4;
  undefined1 local_ce0 [8];
  float fStack_cd8;
  float fStack_cd4;
  float fStack_cd0;
  float fStack_ccc;
  float fStack_cc8;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  Primitive *local_958;
  ulong local_950;
  ulong local_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined4 uStack_7f8;
  undefined4 uStack_7f4;
  undefined4 uStack_7f0;
  undefined4 uStack_7ec;
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [32];
  uint local_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint uStack_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint local_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  uint uStack_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined4 local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined4 uStack_528;
  undefined4 uStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  uint local_480;
  uint uStack_47c;
  uint uStack_478;
  uint uStack_474;
  uint uStack_470;
  uint uStack_46c;
  uint uStack_468;
  uint uStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar1 = prim[1];
  uVar61 = (ulong)(byte)PVar1;
  fVar69 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar71._0_4_ = fVar69 * auVar4._0_4_;
  auVar71._4_4_ = fVar69 * auVar4._4_4_;
  auVar71._8_4_ = fVar69 * auVar4._8_4_;
  auVar71._12_4_ = fVar69 * auVar4._12_4_;
  auVar135._0_4_ = fVar69 * auVar5._0_4_;
  auVar135._4_4_ = fVar69 * auVar5._4_4_;
  auVar135._8_4_ = fVar69 * auVar5._8_4_;
  auVar135._12_4_ = fVar69 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xc + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xd + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x12 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x13 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x14 + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar262._4_4_ = auVar135._0_4_;
  auVar262._0_4_ = auVar135._0_4_;
  auVar262._8_4_ = auVar135._0_4_;
  auVar262._12_4_ = auVar135._0_4_;
  auVar100 = vshufps_avx(auVar135,auVar135,0x55);
  auVar72 = vshufps_avx(auVar135,auVar135,0xaa);
  fVar69 = auVar72._0_4_;
  auVar233._0_4_ = fVar69 * auVar6._0_4_;
  fVar95 = auVar72._4_4_;
  auVar233._4_4_ = fVar95 * auVar6._4_4_;
  fVar96 = auVar72._8_4_;
  auVar233._8_4_ = fVar96 * auVar6._8_4_;
  fVar97 = auVar72._12_4_;
  auVar233._12_4_ = fVar97 * auVar6._12_4_;
  auVar228._0_4_ = auVar9._0_4_ * fVar69;
  auVar228._4_4_ = auVar9._4_4_ * fVar95;
  auVar228._8_4_ = auVar9._8_4_ * fVar96;
  auVar228._12_4_ = auVar9._12_4_ * fVar97;
  auVar211._0_4_ = auVar132._0_4_ * fVar69;
  auVar211._4_4_ = auVar132._4_4_ * fVar95;
  auVar211._8_4_ = auVar132._8_4_ * fVar96;
  auVar211._12_4_ = auVar132._12_4_ * fVar97;
  auVar72 = vfmadd231ps_fma(auVar233,auVar100,auVar5);
  auVar133 = vfmadd231ps_fma(auVar228,auVar100,auVar8);
  auVar100 = vfmadd231ps_fma(auVar211,auVar73,auVar100);
  auVar150 = vfmadd231ps_fma(auVar72,auVar262,auVar4);
  auVar133 = vfmadd231ps_fma(auVar133,auVar262,auVar7);
  auVar77 = vfmadd231ps_fma(auVar100,auVar74,auVar262);
  auVar263._4_4_ = auVar71._0_4_;
  auVar263._0_4_ = auVar71._0_4_;
  auVar263._8_4_ = auVar71._0_4_;
  auVar263._12_4_ = auVar71._0_4_;
  auVar100 = vshufps_avx(auVar71,auVar71,0x55);
  auVar72 = vshufps_avx(auVar71,auVar71,0xaa);
  fVar69 = auVar72._0_4_;
  auVar184._0_4_ = fVar69 * auVar6._0_4_;
  fVar95 = auVar72._4_4_;
  auVar184._4_4_ = fVar95 * auVar6._4_4_;
  fVar96 = auVar72._8_4_;
  auVar184._8_4_ = fVar96 * auVar6._8_4_;
  fVar97 = auVar72._12_4_;
  auVar184._12_4_ = fVar97 * auVar6._12_4_;
  auVar99._0_4_ = auVar9._0_4_ * fVar69;
  auVar99._4_4_ = auVar9._4_4_ * fVar95;
  auVar99._8_4_ = auVar9._8_4_ * fVar96;
  auVar99._12_4_ = auVar9._12_4_ * fVar97;
  auVar72._0_4_ = auVar132._0_4_ * fVar69;
  auVar72._4_4_ = auVar132._4_4_ * fVar95;
  auVar72._8_4_ = auVar132._8_4_ * fVar96;
  auVar72._12_4_ = auVar132._12_4_ * fVar97;
  auVar5 = vfmadd231ps_fma(auVar184,auVar100,auVar5);
  auVar6 = vfmadd231ps_fma(auVar99,auVar100,auVar8);
  auVar8 = vfmadd231ps_fma(auVar72,auVar100,auVar73);
  auVar9 = vfmadd231ps_fma(auVar5,auVar263,auVar4);
  auVar73 = vfmadd231ps_fma(auVar6,auVar263,auVar7);
  auVar132 = vfmadd231ps_fma(auVar8,auVar263,auVar74);
  auVar225._8_4_ = 0x7fffffff;
  auVar225._0_8_ = 0x7fffffff7fffffff;
  auVar225._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx(auVar150,auVar225);
  auVar173._8_4_ = 0x219392ef;
  auVar173._0_8_ = 0x219392ef219392ef;
  auVar173._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar173,1);
  auVar5 = vblendvps_avx(auVar150,auVar173,auVar4);
  auVar4 = vandps_avx(auVar133,auVar225);
  auVar4 = vcmpps_avx(auVar4,auVar173,1);
  auVar6 = vblendvps_avx(auVar133,auVar173,auVar4);
  auVar4 = vandps_avx(auVar225,auVar77);
  auVar4 = vcmpps_avx(auVar4,auVar173,1);
  auVar4 = vblendvps_avx(auVar77,auVar173,auVar4);
  auVar7 = vrcpps_avx(auVar5);
  auVar212._8_4_ = 0x3f800000;
  auVar212._0_8_ = 0x3f8000003f800000;
  auVar212._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar7,auVar212);
  auVar7 = vfmadd132ps_fma(auVar5,auVar7,auVar7);
  auVar5 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar5,auVar212);
  auVar8 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar6 = vfnmadd213ps_fma(auVar4,auVar5,auVar212);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar74 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar77._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar77._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar77._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar77._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vsubps_avx(auVar4,auVar9);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar61 * 0xe + 6);
  auVar4 = vpmovsxwd_avx(auVar6);
  auVar185._0_4_ = auVar7._0_4_ * auVar5._0_4_;
  auVar185._4_4_ = auVar7._4_4_ * auVar5._4_4_;
  auVar185._8_4_ = auVar7._8_4_ * auVar5._8_4_;
  auVar185._12_4_ = auVar7._12_4_ * auVar5._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar73);
  auVar198._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar198._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar198._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar198._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar133._1_3_ = 0;
  auVar133[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar73);
  auVar100._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar100._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar100._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar100._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar61 * 0x15 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vsubps_avx(auVar4,auVar132);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar9);
  auVar150._0_4_ = auVar74._0_4_ * auVar5._0_4_;
  auVar150._4_4_ = auVar74._4_4_ * auVar5._4_4_;
  auVar150._8_4_ = auVar74._8_4_ * auVar5._8_4_;
  auVar150._12_4_ = auVar74._12_4_ * auVar5._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar132);
  auVar73._0_4_ = auVar74._0_4_ * auVar4._0_4_;
  auVar73._4_4_ = auVar74._4_4_ * auVar4._4_4_;
  auVar73._8_4_ = auVar74._8_4_ * auVar4._8_4_;
  auVar73._12_4_ = auVar74._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar77,auVar185);
  auVar5 = vpminsd_avx(auVar198,auVar100);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar150,auVar73);
  uVar66 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar229._4_4_ = uVar66;
  auVar229._0_4_ = uVar66;
  auVar229._8_4_ = uVar66;
  auVar229._12_4_ = uVar66;
  auVar5 = vmaxps_avx(auVar5,auVar229);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_740._0_4_ = auVar4._0_4_ * 0.99999964;
  local_740._4_4_ = auVar4._4_4_ * 0.99999964;
  local_740._8_4_ = auVar4._8_4_ * 0.99999964;
  local_740._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar77,auVar185);
  auVar5 = vpmaxsd_avx(auVar198,auVar100);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar150,auVar73);
  uVar66 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar132._4_4_ = uVar66;
  auVar132._0_4_ = uVar66;
  auVar132._8_4_ = uVar66;
  auVar132._12_4_ = uVar66;
  auVar5 = vminps_avx(auVar5,auVar132);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar133[4] = PVar1;
  auVar133._5_3_ = 0;
  auVar133[8] = PVar1;
  auVar133._9_3_ = 0;
  auVar133[0xc] = PVar1;
  auVar133._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar133,_DAT_01f4ad30);
  auVar74._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar4 = vcmpps_avx(local_740,auVar74,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  uVar66 = vmovmskps_avx(auVar4);
  local_948 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar66);
  auVar84._16_16_ = mm_lookupmask_ps._240_16_;
  auVar84._0_16_ = mm_lookupmask_ps._240_16_;
  local_660 = vblendps_avx(auVar84,ZEXT832(0) << 0x20,0x80);
  iVar58 = 1 << ((uint)k & 0x1f);
  auVar85._4_4_ = iVar58;
  auVar85._0_4_ = iVar58;
  auVar85._8_4_ = iVar58;
  auVar85._12_4_ = iVar58;
  auVar85._16_4_ = iVar58;
  auVar85._20_4_ = iVar58;
  auVar85._24_4_ = iVar58;
  auVar85._28_4_ = iVar58;
  auVar235 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar84 = vpand_avx2(auVar85,auVar235);
  local_720 = vpcmpeqd_avx2(auVar84,auVar235);
  local_958 = prim;
LAB_0119a722:
  if (local_948 == 0) {
LAB_0119cdf2:
    return local_948 != 0;
  }
  lVar62 = 0;
  for (uVar61 = local_948; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar62 = lVar62 + 1;
  }
  uVar60 = *(uint *)(local_958 + 2);
  local_700 = *(uint *)(local_958 + lVar62 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar60].ptr;
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_700);
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar62 = *(long *)&pGVar2[1].time_range.upper;
  auVar4 = *(undefined1 (*) [16])(lVar62 + (long)p_Var3 * uVar61);
  auVar5 = *(undefined1 (*) [16])(lVar62 + (uVar61 + 1) * (long)p_Var3);
  auVar6 = *(undefined1 (*) [16])(lVar62 + (uVar61 + 2) * (long)p_Var3);
  local_950 = local_948 - 1 & local_948;
  auVar7 = *(undefined1 (*) [16])(lVar62 + (uVar61 + 3) * (long)p_Var3);
  if (local_950 != 0) {
    uVar65 = local_950 - 1 & local_950;
    for (uVar61 = local_950; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    }
    if (uVar65 != 0) {
      for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar9 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar66 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar246._4_4_ = uVar66;
  auVar246._0_4_ = uVar66;
  auVar246._8_4_ = uVar66;
  auVar246._12_4_ = uVar66;
  fStack_7d0 = (float)uVar66;
  _local_7e0 = auVar246;
  fStack_7cc = (float)uVar66;
  fStack_7c8 = (float)uVar66;
  register0x0000151c = uVar66;
  uVar66 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar255._4_4_ = uVar66;
  auVar255._0_4_ = uVar66;
  auVar255._8_4_ = uVar66;
  auVar255._12_4_ = uVar66;
  fStack_890 = (float)uVar66;
  _local_8a0 = auVar255;
  fStack_88c = (float)uVar66;
  fStack_888 = (float)uVar66;
  register0x0000155c = uVar66;
  auVar8 = vunpcklps_avx(auVar246,auVar255);
  fVar69 = *(float *)(ray + k * 4 + 0xc0);
  auVar268._4_4_ = fVar69;
  auVar268._0_4_ = fVar69;
  auVar268._8_4_ = fVar69;
  auVar268._12_4_ = fVar69;
  fStack_8b0 = fVar69;
  _local_8c0 = auVar268;
  fStack_8ac = fVar69;
  fStack_8a8 = fVar69;
  uStack_8a4 = fVar69;
  local_a30 = vinsertps_avx(auVar8,auVar268,0x28);
  auVar186._0_4_ = (auVar6._0_4_ + auVar4._0_4_ + auVar5._0_4_ + auVar7._0_4_) * 0.25;
  auVar186._4_4_ = (auVar6._4_4_ + auVar4._4_4_ + auVar5._4_4_ + auVar7._4_4_) * 0.25;
  auVar186._8_4_ = (auVar6._8_4_ + auVar4._8_4_ + auVar5._8_4_ + auVar7._8_4_) * 0.25;
  auVar186._12_4_ = (auVar6._12_4_ + auVar4._12_4_ + auVar5._12_4_ + auVar7._12_4_) * 0.25;
  auVar8 = vsubps_avx(auVar186,auVar9);
  auVar8 = vdpps_avx(auVar8,local_a30,0x7f);
  local_a40 = vdpps_avx(local_a30,local_a30,0x7f);
  auVar232 = ZEXT1664(local_a40);
  auVar74 = vrcpss_avx(local_a40,local_a40);
  auVar73 = vfnmadd213ss_fma(auVar74,local_a40,ZEXT416(0x40000000));
  local_3c0 = auVar8._0_4_ * auVar74._0_4_ * auVar73._0_4_;
  auVar199._4_4_ = local_3c0;
  auVar199._0_4_ = local_3c0;
  auVar199._8_4_ = local_3c0;
  auVar199._12_4_ = local_3c0;
  fStack_930 = local_3c0;
  _local_940 = auVar199;
  fStack_92c = local_3c0;
  fStack_928 = local_3c0;
  fStack_924 = local_3c0;
  auVar8 = vfmadd231ps_fma(auVar9,local_a30,auVar199);
  auVar8 = vblendps_avx(auVar8,_DAT_01f45a50,8);
  auVar9 = vsubps_avx(auVar4,auVar8);
  auVar74 = vsubps_avx(auVar6,auVar8);
  auVar224 = ZEXT1664(auVar74);
  auVar73 = vsubps_avx(auVar5,auVar8);
  auVar7 = vsubps_avx(auVar7,auVar8);
  auVar4 = vmovshdup_avx(auVar9);
  uVar70 = auVar4._0_8_;
  local_680._8_8_ = uVar70;
  local_680._0_8_ = uVar70;
  local_680._16_8_ = uVar70;
  local_680._24_8_ = uVar70;
  auVar4 = vshufps_avx(auVar9,auVar9,0xaa);
  uVar70 = auVar4._0_8_;
  local_6a0._8_8_ = uVar70;
  local_6a0._0_8_ = uVar70;
  local_6a0._16_8_ = uVar70;
  local_6a0._24_8_ = uVar70;
  auVar4 = vshufps_avx(auVar9,auVar9,0xff);
  uVar70 = auVar4._0_8_;
  local_380._8_8_ = uVar70;
  local_380._0_8_ = uVar70;
  local_380._16_8_ = uVar70;
  local_380._24_8_ = uVar70;
  auVar4 = vmovshdup_avx(auVar73);
  local_a20 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar73,auVar73,0xaa);
  uVar70 = auVar4._0_8_;
  local_9e0._8_8_ = uVar70;
  local_9e0._0_8_ = uVar70;
  local_9e0._16_8_ = uVar70;
  local_9e0._24_8_ = uVar70;
  auVar242 = ZEXT3264(local_9e0);
  auVar5 = vshufps_avx(auVar73,auVar73,0xff);
  uVar70 = auVar5._0_8_;
  auVar264._8_8_ = uVar70;
  auVar264._0_8_ = uVar70;
  auVar264._16_8_ = uVar70;
  auVar264._24_8_ = uVar70;
  auVar4 = vmovshdup_avx(auVar74);
  local_620 = auVar4._0_4_;
  fStack_61c = auVar4._4_4_;
  auVar4 = vshufps_avx(auVar74,auVar74,0xaa);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vshufps_avx(auVar74,auVar74,0xff);
  local_640 = auVar4._0_4_;
  fStack_63c = auVar4._4_4_;
  auVar4 = vmovshdup_avx(auVar7);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(auVar7,auVar7,0xaa);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vshufps_avx(auVar7,auVar7,0xff);
  local_240 = auVar4._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar4 = vfmadd231ps_fma(ZEXT432((uint)(fVar69 * fVar69)),_local_8a0,_local_8a0);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_7e0,_local_7e0);
  uVar66 = auVar4._0_4_;
  local_260._4_4_ = uVar66;
  local_260._0_4_ = uVar66;
  local_260._8_4_ = uVar66;
  local_260._12_4_ = uVar66;
  local_260._16_4_ = uVar66;
  local_260._20_4_ = uVar66;
  local_260._24_4_ = uVar66;
  local_260._28_4_ = uVar66;
  fVar69 = *(float *)(ray + k * 4 + 0x60);
  local_970 = ZEXT416((uint)local_3c0);
  local_3c0 = fVar69 - local_3c0;
  fStack_3bc = local_3c0;
  fStack_3b8 = local_3c0;
  fStack_3b4 = local_3c0;
  fStack_3b0 = local_3c0;
  fStack_3ac = local_3c0;
  fStack_3a8 = local_3c0;
  fStack_3a4 = local_3c0;
  uVar61 = 0;
  bVar64 = 0;
  local_ce4 = 1;
  uVar66 = auVar9._0_4_;
  local_3a0._4_4_ = uVar66;
  local_3a0._0_4_ = uVar66;
  local_3a0._8_4_ = uVar66;
  local_3a0._12_4_ = uVar66;
  local_3a0._16_4_ = uVar66;
  local_3a0._20_4_ = uVar66;
  local_3a0._24_4_ = uVar66;
  local_3a0._28_4_ = uVar66;
  fVar95 = auVar73._0_4_;
  auVar235._4_4_ = fVar95;
  auVar235._0_4_ = fVar95;
  auVar235._8_4_ = fVar95;
  auVar235._12_4_ = fVar95;
  auVar235._16_4_ = fVar95;
  auVar235._20_4_ = fVar95;
  auVar235._24_4_ = fVar95;
  auVar235._28_4_ = fVar95;
  fVar97 = auVar74._0_4_;
  local_280 = fVar97;
  fStack_27c = fVar97;
  fStack_278 = fVar97;
  fStack_274 = fVar97;
  fStack_270 = fVar97;
  fStack_26c = fVar97;
  fStack_268 = fVar97;
  fStack_264 = fVar97;
  fVar96 = auVar7._0_4_;
  local_2a0 = fVar96;
  fStack_29c = fVar96;
  fStack_298 = fVar96;
  fStack_294 = fVar96;
  fStack_290 = fVar96;
  fStack_28c = fVar96;
  fStack_288 = fVar96;
  fStack_284 = fVar96;
  local_8e0._8_4_ = 0x7fffffff;
  local_8e0._0_8_ = 0x7fffffff7fffffff;
  local_8e0._12_4_ = 0x7fffffff;
  local_8e0._16_4_ = 0x7fffffff;
  local_8e0._20_4_ = 0x7fffffff;
  local_8e0._24_4_ = 0x7fffffff;
  local_8e0._28_4_ = 0x7fffffff;
  local_6c0 = vandps_avx(local_260,local_8e0);
  auVar4 = vsqrtss_avx(local_a40,local_a40);
  auVar6 = vsqrtss_avx(local_a40,local_a40);
  auVar259 = ZEXT3264(local_9e0);
  auVar249 = ZEXT3264(CONCAT824(local_a20,CONCAT816(local_a20,CONCAT88(local_a20,local_a20))));
  local_730 = ZEXT816(0x3f80000000000000);
  local_a80 = auVar235;
  uStack_a18 = local_a20;
  uStack_a10 = local_a20;
  uStack_a08 = local_a20;
  uStack_6fc = local_700;
  uStack_6f8 = local_700;
  uStack_6f4 = local_700;
  uStack_6f0 = local_700;
  uStack_6ec = local_700;
  uStack_6e8 = local_700;
  uStack_6e4 = local_700;
  local_6e0 = uVar60;
  uStack_6dc = uVar60;
  uStack_6d8 = uVar60;
  uStack_6d4 = uVar60;
  uStack_6d0 = uVar60;
  uStack_6cc = uVar60;
  uStack_6c8 = uVar60;
  uStack_6c4 = uVar60;
  fStack_638 = local_640;
  fStack_634 = fStack_63c;
  fStack_630 = local_640;
  fStack_62c = fStack_63c;
  fStack_628 = local_640;
  fStack_624 = fStack_63c;
  fStack_618 = local_620;
  fStack_614 = fStack_61c;
  fStack_610 = local_620;
  fStack_60c = fStack_61c;
  fStack_608 = local_620;
  fStack_604 = fStack_61c;
  do {
    auVar180._8_4_ = 0x3f800000;
    auVar180._0_8_ = 0x3f8000003f800000;
    auVar180._12_4_ = 0x3f800000;
    auVar180._16_4_ = 0x3f800000;
    auVar180._20_4_ = 0x3f800000;
    auVar180._24_4_ = 0x3f800000;
    auVar180._28_4_ = 0x3f800000;
    auVar8 = vmovshdup_avx(local_730);
    auVar8 = vsubps_avx(auVar8,local_730);
    fVar129 = auVar8._0_4_;
    fVar131 = fVar129 * 0.04761905;
    local_840._0_4_ = local_730._0_4_;
    local_840._4_4_ = local_840._0_4_;
    local_840._8_4_ = local_840._0_4_;
    local_840._12_4_ = local_840._0_4_;
    local_840._16_4_ = local_840._0_4_;
    local_840._20_4_ = local_840._0_4_;
    local_840._24_4_ = local_840._0_4_;
    local_840._28_4_ = local_840._0_4_;
    local_860._4_4_ = fVar129;
    local_860._0_4_ = fVar129;
    local_860._8_4_ = fVar129;
    local_860._12_4_ = fVar129;
    local_860._16_4_ = fVar129;
    local_860._20_4_ = fVar129;
    local_860._24_4_ = fVar129;
    local_860._28_4_ = fVar129;
    auVar8 = vfmadd231ps_fma(local_840,local_860,_DAT_01f7b040);
    auVar84 = vsubps_avx(auVar180,ZEXT1632(auVar8));
    fVar98 = auVar8._0_4_;
    auVar270._0_4_ = auVar235._0_4_ * fVar98;
    fVar126 = auVar8._4_4_;
    auVar270._4_4_ = auVar235._4_4_ * fVar126;
    fVar127 = auVar8._8_4_;
    auVar270._8_4_ = auVar235._8_4_ * fVar127;
    fVar128 = auVar8._12_4_;
    auVar270._12_4_ = auVar235._12_4_ * fVar128;
    auVar270._16_4_ = auVar235._16_4_ * 0.0;
    auVar270._20_4_ = auVar235._20_4_ * 0.0;
    auVar270._28_36_ = auVar242._28_36_;
    auVar270._24_4_ = auVar235._24_4_ * 0.0;
    auVar242._0_4_ = auVar249._0_4_ * fVar98;
    auVar242._4_4_ = auVar249._4_4_ * fVar126;
    auVar242._8_4_ = auVar249._8_4_ * fVar127;
    auVar242._12_4_ = auVar249._12_4_ * fVar128;
    auVar242._16_4_ = auVar249._16_4_ * 0.0;
    auVar242._20_4_ = auVar249._20_4_ * 0.0;
    auVar242._28_36_ = auVar224._28_36_;
    auVar242._24_4_ = auVar249._24_4_ * 0.0;
    auVar224._0_4_ = auVar259._0_4_ * fVar98;
    auVar224._4_4_ = auVar259._4_4_ * fVar126;
    auVar224._8_4_ = auVar259._8_4_ * fVar127;
    auVar224._12_4_ = auVar259._12_4_ * fVar128;
    auVar224._16_4_ = auVar259._16_4_ * 0.0;
    auVar224._20_4_ = auVar259._20_4_ * 0.0;
    auVar224._28_36_ = auVar232._28_36_;
    auVar224._24_4_ = auVar259._24_4_ * 0.0;
    fVar130 = auVar5._0_4_;
    fVar197 = auVar5._4_4_;
    auVar11._4_4_ = fVar197 * fVar126;
    auVar11._0_4_ = fVar130 * fVar98;
    auVar11._8_4_ = fVar130 * fVar127;
    auVar11._12_4_ = fVar197 * fVar128;
    auVar11._16_4_ = fVar130 * 0.0;
    auVar11._20_4_ = fVar197 * 0.0;
    auVar11._24_4_ = fVar130 * 0.0;
    auVar11._28_4_ = fVar129;
    auVar8 = vfmadd231ps_fma(auVar270._0_32_,auVar84,local_3a0);
    auVar132 = vfmadd231ps_fma(auVar242._0_32_,auVar84,local_680);
    auVar100 = vfmadd231ps_fma(auVar224._0_32_,auVar84,local_6a0);
    auVar72 = vfmadd231ps_fma(auVar11,auVar84,local_380);
    auVar86._4_4_ = fStack_27c;
    auVar86._0_4_ = local_280;
    auVar86._8_4_ = fStack_278;
    auVar86._12_4_ = fStack_274;
    auVar86._16_4_ = fStack_270;
    auVar86._20_4_ = fStack_26c;
    auVar86._24_4_ = fStack_268;
    auVar86._28_4_ = fStack_264;
    auVar12._4_4_ = fStack_27c * fVar126;
    auVar12._0_4_ = local_280 * fVar98;
    auVar12._8_4_ = fStack_278 * fVar127;
    auVar12._12_4_ = fStack_274 * fVar128;
    auVar12._16_4_ = fStack_270 * 0.0;
    auVar12._20_4_ = fStack_26c * 0.0;
    auVar12._24_4_ = fStack_268 * 0.0;
    auVar12._28_4_ = local_380._28_4_;
    auVar89._4_4_ = fVar126 * fStack_61c;
    auVar89._0_4_ = fVar98 * local_620;
    auVar89._8_4_ = fVar127 * fStack_618;
    auVar89._12_4_ = fVar128 * fStack_614;
    auVar89._16_4_ = fStack_610 * 0.0;
    auVar89._20_4_ = fStack_60c * 0.0;
    auVar89._24_4_ = fStack_608 * 0.0;
    auVar89._28_4_ = local_3a0._28_4_;
    auVar141._8_8_ = uStack_1d8;
    auVar141._0_8_ = local_1e0;
    auVar141._16_8_ = uStack_1d0;
    auVar141._24_8_ = uStack_1c8;
    auVar13._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar126;
    auVar13._0_4_ = (float)local_1e0 * fVar98;
    auVar13._8_4_ = (float)uStack_1d8 * fVar127;
    auVar13._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar128;
    auVar13._16_4_ = (float)uStack_1d0 * 0.0;
    auVar13._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar13._24_4_ = (float)uStack_1c8 * 0.0;
    auVar13._28_4_ = 0x3f800000;
    auVar55._4_4_ = fVar126 * fStack_63c;
    auVar55._0_4_ = fVar98 * local_640;
    auVar55._8_4_ = fVar127 * fStack_638;
    auVar55._12_4_ = fVar128 * fStack_634;
    auVar55._16_4_ = fStack_630 * 0.0;
    auVar55._20_4_ = fStack_62c * 0.0;
    auVar55._24_4_ = fStack_628 * 0.0;
    auVar55._28_4_ = DAT_01f7b040._28_4_;
    auVar133 = vfmadd231ps_fma(auVar12,auVar84,auVar235);
    auVar150 = vfmadd231ps_fma(auVar89,auVar84,auVar249._0_32_);
    auVar77 = vfmadd231ps_fma(auVar13,auVar84,auVar259._0_32_);
    auVar71 = vfmadd231ps_fma(auVar55,auVar84,auVar264);
    auVar260._0_4_ = fVar98 * local_2a0;
    auVar260._4_4_ = fVar126 * fStack_29c;
    auVar260._8_4_ = fVar127 * fStack_298;
    auVar260._12_4_ = fVar128 * fStack_294;
    auVar260._16_4_ = fStack_290 * 0.0;
    auVar260._20_4_ = fStack_28c * 0.0;
    auVar260._28_36_ = auVar259._28_36_;
    auVar260._24_4_ = fStack_288 * 0.0;
    auVar232._0_4_ = fVar98 * (float)local_200;
    auVar232._4_4_ = fVar126 * local_200._4_4_;
    auVar232._8_4_ = fVar127 * (float)uStack_1f8;
    auVar232._12_4_ = fVar128 * uStack_1f8._4_4_;
    auVar232._16_4_ = (float)uStack_1f0 * 0.0;
    auVar232._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar232._28_36_ = auVar249._28_36_;
    auVar232._24_4_ = (float)uStack_1e8 * 0.0;
    auVar182._28_4_ = local_6a0._28_4_;
    auVar182._0_28_ =
         ZEXT1628(CONCAT412(auVar133._12_4_ * fVar128,
                            CONCAT48(auVar133._8_4_ * fVar127,
                                     CONCAT44(auVar133._4_4_ * fVar126,auVar133._0_4_ * fVar98))));
    auVar8 = vfmadd231ps_fma(auVar182,auVar84,ZEXT1632(auVar8));
    auVar132 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar150._12_4_,
                                                  CONCAT48(fVar127 * auVar150._8_4_,
                                                           CONCAT44(fVar126 * auVar150._4_4_,
                                                                    fVar98 * auVar150._0_4_)))),
                               auVar84,ZEXT1632(auVar132));
    auVar167._28_4_ = auVar235._28_4_;
    auVar167._0_28_ =
         ZEXT1628(CONCAT412(fVar128 * auVar77._12_4_,
                            CONCAT48(fVar127 * auVar77._8_4_,
                                     CONCAT44(fVar126 * auVar77._4_4_,fVar98 * auVar77._0_4_))));
    auVar100 = vfmadd231ps_fma(auVar167,auVar84,ZEXT1632(auVar100));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar71._12_4_,
                                                 CONCAT48(fVar127 * auVar71._8_4_,
                                                          CONCAT44(fVar126 * auVar71._4_4_,
                                                                   fVar98 * auVar71._0_4_)))),
                              auVar84,ZEXT1632(auVar72));
    auVar215._0_4_ = fVar98 * (float)local_220;
    auVar215._4_4_ = fVar126 * local_220._4_4_;
    auVar215._8_4_ = fVar127 * (float)uStack_218;
    auVar215._12_4_ = fVar128 * uStack_218._4_4_;
    auVar215._16_4_ = (float)uStack_210 * 0.0;
    auVar215._20_4_ = uStack_210._4_4_ * 0.0;
    auVar215._24_4_ = (float)uStack_208 * 0.0;
    auVar215._28_4_ = 0;
    auVar99 = vfmadd231ps_fma(auVar260._0_32_,auVar84,auVar86);
    auVar133 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar99._12_4_ * fVar128,
                                                  CONCAT48(auVar99._8_4_ * fVar127,
                                                           CONCAT44(auVar99._4_4_ * fVar126,
                                                                    auVar99._0_4_ * fVar98)))),
                               auVar84,ZEXT1632(auVar133));
    auVar226._0_4_ = fVar98 * (float)local_240;
    auVar226._4_4_ = fVar126 * local_240._4_4_;
    auVar226._8_4_ = fVar127 * (float)uStack_238;
    auVar226._12_4_ = fVar128 * uStack_238._4_4_;
    auVar226._16_4_ = (float)uStack_230 * 0.0;
    auVar226._20_4_ = uStack_230._4_4_ * 0.0;
    auVar226._24_4_ = (float)uStack_228 * 0.0;
    auVar226._28_4_ = 0;
    auVar204._4_4_ = fStack_61c;
    auVar204._0_4_ = local_620;
    auVar204._8_4_ = fStack_618;
    auVar204._12_4_ = fStack_614;
    auVar204._16_4_ = fStack_610;
    auVar204._20_4_ = fStack_60c;
    auVar204._24_4_ = fStack_608;
    auVar204._28_4_ = fStack_604;
    auVar99 = vfmadd231ps_fma(auVar232._0_32_,auVar84,auVar204);
    auVar173 = vfmadd231ps_fma(auVar215,auVar84,auVar141);
    auVar14._4_4_ = fStack_63c;
    auVar14._0_4_ = local_640;
    auVar14._8_4_ = fStack_638;
    auVar14._12_4_ = fStack_634;
    auVar14._16_4_ = fStack_630;
    auVar14._20_4_ = fStack_62c;
    auVar14._24_4_ = fStack_628;
    auVar14._28_4_ = fStack_624;
    auVar135 = vfmadd231ps_fma(auVar226,auVar84,auVar14);
    auVar56._28_4_ = fVar197;
    auVar56._0_28_ =
         ZEXT1628(CONCAT412(auVar135._12_4_ * fVar128,
                            CONCAT48(auVar135._8_4_ * fVar127,
                                     CONCAT44(auVar135._4_4_ * fVar126,auVar135._0_4_ * fVar98))));
    auVar150 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar99._12_4_ * fVar128,
                                                  CONCAT48(auVar99._8_4_ * fVar127,
                                                           CONCAT44(auVar99._4_4_ * fVar126,
                                                                    auVar99._0_4_ * fVar98)))),
                               auVar84,ZEXT1632(auVar150));
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar173._12_4_,
                                                 CONCAT48(fVar127 * auVar173._8_4_,
                                                          CONCAT44(fVar126 * auVar173._4_4_,
                                                                   fVar98 * auVar173._0_4_)))),
                              auVar84,ZEXT1632(auVar77));
    auVar71 = vfmadd231ps_fma(auVar56,auVar84,ZEXT1632(auVar71));
    auVar166._28_4_ = fStack_264;
    auVar166._0_28_ =
         ZEXT1628(CONCAT412(fVar128 * auVar77._12_4_,
                            CONCAT48(fVar127 * auVar77._8_4_,
                                     CONCAT44(fVar126 * auVar77._4_4_,fVar98 * auVar77._0_4_))));
    auVar99 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar133._12_4_ * fVar128,
                                                 CONCAT48(auVar133._8_4_ * fVar127,
                                                          CONCAT44(auVar133._4_4_ * fVar126,
                                                                   auVar133._0_4_ * fVar98)))),
                              auVar84,ZEXT1632(auVar8));
    auVar173 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar150._12_4_ * fVar128,
                                                  CONCAT48(auVar150._8_4_ * fVar127,
                                                           CONCAT44(auVar150._4_4_ * fVar126,
                                                                    auVar150._0_4_ * fVar98)))),
                               auVar84,ZEXT1632(auVar132));
    auVar135 = vfmadd231ps_fma(auVar166,auVar84,ZEXT1632(auVar100));
    auVar184 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar128,
                                                  CONCAT48(auVar71._8_4_ * fVar127,
                                                           CONCAT44(auVar71._4_4_ * fVar126,
                                                                    auVar71._0_4_ * fVar98)))),
                               ZEXT1632(auVar72),auVar84);
    auVar141 = ZEXT1632(auVar184);
    auVar235 = vsubps_avx(ZEXT1632(auVar133),ZEXT1632(auVar8));
    auVar84 = vsubps_avx(ZEXT1632(auVar150),ZEXT1632(auVar132));
    auVar85 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar100));
    auVar11 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar72));
    fVar197 = fVar131 * auVar235._0_4_ * 3.0;
    fVar205 = fVar131 * auVar235._4_4_ * 3.0;
    local_a60._4_4_ = fVar205;
    local_a60._0_4_ = fVar197;
    fVar206 = fVar131 * auVar235._8_4_ * 3.0;
    local_a60._8_4_ = fVar206;
    fVar207 = fVar131 * auVar235._12_4_ * 3.0;
    local_a60._12_4_ = fVar207;
    fVar208 = fVar131 * auVar235._16_4_ * 3.0;
    local_a60._16_4_ = fVar208;
    fVar209 = fVar131 * auVar235._20_4_ * 3.0;
    local_a60._20_4_ = fVar209;
    fVar210 = fVar131 * auVar235._24_4_ * 3.0;
    local_a60._24_4_ = fVar210;
    local_a60._28_4_ = auVar85._28_4_;
    local_aa0._0_4_ = fVar131 * auVar84._0_4_ * 3.0;
    local_aa0._4_4_ = fVar131 * auVar84._4_4_ * 3.0;
    local_aa0._8_4_ = fVar131 * auVar84._8_4_ * 3.0;
    local_aa0._12_4_ = fVar131 * auVar84._12_4_ * 3.0;
    local_aa0._16_4_ = fVar131 * auVar84._16_4_ * 3.0;
    local_aa0._20_4_ = fVar131 * auVar84._20_4_ * 3.0;
    local_aa0._24_4_ = fVar131 * auVar84._24_4_ * 3.0;
    local_aa0._28_4_ = 0;
    auVar236._0_4_ = fVar131 * auVar85._0_4_ * 3.0;
    auVar236._4_4_ = fVar131 * auVar85._4_4_ * 3.0;
    auVar236._8_4_ = fVar131 * auVar85._8_4_ * 3.0;
    auVar236._12_4_ = fVar131 * auVar85._12_4_ * 3.0;
    auVar236._16_4_ = fVar131 * auVar85._16_4_ * 3.0;
    auVar236._20_4_ = fVar131 * auVar85._20_4_ * 3.0;
    auVar236._24_4_ = fVar131 * auVar85._24_4_ * 3.0;
    auVar236._28_4_ = 0;
    fVar98 = fVar131 * auVar11._0_4_ * 3.0;
    fVar126 = fVar131 * auVar11._4_4_ * 3.0;
    auVar15._4_4_ = fVar126;
    auVar15._0_4_ = fVar98;
    fVar127 = fVar131 * auVar11._8_4_ * 3.0;
    auVar15._8_4_ = fVar127;
    fVar128 = fVar131 * auVar11._12_4_ * 3.0;
    auVar15._12_4_ = fVar128;
    fVar129 = fVar131 * auVar11._16_4_ * 3.0;
    auVar15._16_4_ = fVar129;
    fVar130 = fVar131 * auVar11._20_4_ * 3.0;
    auVar15._20_4_ = fVar130;
    fVar131 = fVar131 * auVar11._24_4_ * 3.0;
    auVar15._24_4_ = fVar131;
    auVar15._28_4_ = auVar235._28_4_;
    local_a00 = ZEXT1632(auVar99);
    auVar166 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar99));
    auVar14 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar173));
    auVar86 = ZEXT1632(auVar135);
    auVar204 = vpermps_avx2(_DAT_01fb7720,auVar86);
    local_2e0 = vsubps_avx(auVar166,local_a00);
    local_2c0 = vsubps_avx(auVar204,ZEXT1632(auVar135));
    fVar172 = local_2c0._0_4_;
    fVar147 = local_2c0._4_4_;
    auVar16._4_4_ = fVar147 * fVar205;
    auVar16._0_4_ = fVar172 * fVar197;
    fVar197 = local_2c0._8_4_;
    auVar16._8_4_ = fVar197 * fVar206;
    fVar148 = local_2c0._12_4_;
    auVar16._12_4_ = fVar148 * fVar207;
    fVar149 = local_2c0._16_4_;
    auVar16._16_4_ = fVar149 * fVar208;
    fVar238 = local_2c0._20_4_;
    auVar16._20_4_ = fVar238 * fVar209;
    fVar243 = local_2c0._24_4_;
    auVar16._24_4_ = fVar243 * fVar210;
    auVar16._28_4_ = auVar204._28_4_;
    auVar8 = vfmsub231ps_fma(auVar16,auVar236,local_2e0);
    local_300 = vsubps_avx(auVar14,ZEXT1632(auVar173));
    fVar244 = local_2e0._0_4_;
    fVar245 = local_2e0._4_4_;
    auVar227._4_4_ = fVar245 * local_aa0._4_4_;
    auVar227._0_4_ = fVar244 * (float)local_aa0._0_4_;
    fVar250 = local_2e0._8_4_;
    auVar227._8_4_ = fVar250 * local_aa0._8_4_;
    fVar251 = local_2e0._12_4_;
    auVar227._12_4_ = fVar251 * local_aa0._12_4_;
    fVar252 = local_2e0._16_4_;
    auVar227._16_4_ = fVar252 * local_aa0._16_4_;
    fVar253 = local_2e0._20_4_;
    auVar227._20_4_ = fVar253 * local_aa0._20_4_;
    fVar254 = local_2e0._24_4_;
    auVar227._24_4_ = fVar254 * local_aa0._24_4_;
    auVar227._28_4_ = auVar166._28_4_;
    auVar132 = vfmsub231ps_fma(auVar227,local_a60,local_300);
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar132._12_4_ * auVar132._12_4_,
                                                CONCAT48(auVar132._8_4_ * auVar132._8_4_,
                                                         CONCAT44(auVar132._4_4_ * auVar132._4_4_,
                                                                  auVar132._0_4_ * auVar132._0_4_)))
                                     ),ZEXT1632(auVar8),ZEXT1632(auVar8));
    auVar165._0_4_ = fVar172 * fVar172;
    auVar165._4_4_ = fVar147 * fVar147;
    auVar165._8_4_ = fVar197 * fVar197;
    auVar165._12_4_ = fVar148 * fVar148;
    auVar165._16_4_ = fVar149 * fVar149;
    auVar165._20_4_ = fVar238 * fVar238;
    auVar165._24_4_ = fVar243 * fVar243;
    auVar165._28_4_ = 0;
    auVar132 = vfmadd231ps_fma(auVar165,local_300,local_300);
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),local_2e0,local_2e0);
    fVar205 = local_300._0_4_;
    fVar206 = local_300._4_4_;
    auVar239._4_4_ = fVar206 * auVar236._4_4_;
    auVar239._0_4_ = fVar205 * auVar236._0_4_;
    fVar207 = local_300._8_4_;
    auVar239._8_4_ = fVar207 * auVar236._8_4_;
    fVar208 = local_300._12_4_;
    auVar239._12_4_ = fVar208 * auVar236._12_4_;
    fVar209 = local_300._16_4_;
    auVar239._16_4_ = fVar209 * auVar236._16_4_;
    fVar210 = local_300._20_4_;
    auVar239._20_4_ = fVar210 * auVar236._20_4_;
    fVar261 = local_300._24_4_;
    auVar239._24_4_ = fVar261 * auVar236._24_4_;
    auVar239._28_4_ = auVar14._28_4_;
    auVar84 = vrcpps_avx(ZEXT1632(auVar132));
    auVar100 = vfmsub231ps_fma(auVar239,local_aa0,local_2c0);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar100),ZEXT1632(auVar100));
    auVar87._8_4_ = 0x3f800000;
    auVar87._0_8_ = 0x3f8000003f800000;
    auVar87._12_4_ = 0x3f800000;
    auVar87._16_4_ = 0x3f800000;
    auVar87._20_4_ = 0x3f800000;
    auVar87._24_4_ = 0x3f800000;
    auVar87._28_4_ = 0x3f800000;
    auVar8 = vfnmadd213ps_fma(auVar84,ZEXT1632(auVar132),auVar87);
    auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar84,auVar84);
    local_ac0 = vpermps_avx2(_DAT_01fb7720,local_a60);
    local_ae0 = vpermps_avx2(_DAT_01fb7720,auVar236);
    auVar256._4_4_ = fVar147 * local_ac0._4_4_;
    auVar256._0_4_ = fVar172 * local_ac0._0_4_;
    auVar256._8_4_ = fVar197 * local_ac0._8_4_;
    auVar256._12_4_ = fVar148 * local_ac0._12_4_;
    auVar256._16_4_ = fVar149 * local_ac0._16_4_;
    auVar256._20_4_ = fVar238 * local_ac0._20_4_;
    auVar256._24_4_ = fVar243 * local_ac0._24_4_;
    auVar256._28_4_ = auVar84._28_4_;
    auVar72 = vfmsub231ps_fma(auVar256,local_ae0,local_2e0);
    local_820 = vpermps_avx2(_DAT_01fb7720,local_aa0);
    auVar269._4_4_ = fVar245 * local_820._4_4_;
    auVar269._0_4_ = fVar244 * local_820._0_4_;
    auVar269._8_4_ = fVar250 * local_820._8_4_;
    auVar269._12_4_ = fVar251 * local_820._12_4_;
    auVar269._16_4_ = fVar252 * local_820._16_4_;
    auVar269._20_4_ = fVar253 * local_820._20_4_;
    auVar269._24_4_ = fVar254 * local_820._24_4_;
    auVar269._28_4_ = auVar85._28_4_;
    auVar133 = vfmsub231ps_fma(auVar269,local_ac0,local_300);
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar133._12_4_ * auVar133._12_4_,
                                                 CONCAT48(auVar133._8_4_ * auVar133._8_4_,
                                                          CONCAT44(auVar133._4_4_ * auVar133._4_4_,
                                                                   auVar133._0_4_ * auVar133._0_4_))
                                                )),ZEXT1632(auVar72),ZEXT1632(auVar72));
    auVar192._0_4_ = fVar205 * local_ae0._0_4_;
    auVar192._4_4_ = fVar206 * local_ae0._4_4_;
    auVar192._8_4_ = fVar207 * local_ae0._8_4_;
    auVar192._12_4_ = fVar208 * local_ae0._12_4_;
    auVar192._16_4_ = fVar209 * local_ae0._16_4_;
    auVar192._20_4_ = fVar210 * local_ae0._20_4_;
    auVar192._24_4_ = fVar261 * local_ae0._24_4_;
    auVar192._28_4_ = 0;
    auVar133 = vfmsub231ps_fma(auVar192,local_820,local_2c0);
    auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),ZEXT1632(auVar133),ZEXT1632(auVar133));
    auVar84 = vmaxps_avx(ZEXT1632(CONCAT412(auVar100._12_4_ * auVar8._12_4_,
                                            CONCAT48(auVar100._8_4_ * auVar8._8_4_,
                                                     CONCAT44(auVar100._4_4_ * auVar8._4_4_,
                                                              auVar100._0_4_ * auVar8._0_4_)))),
                         ZEXT1632(CONCAT412(auVar72._12_4_ * auVar8._12_4_,
                                            CONCAT48(auVar72._8_4_ * auVar8._8_4_,
                                                     CONCAT44(auVar72._4_4_ * auVar8._4_4_,
                                                              auVar72._0_4_ * auVar8._0_4_)))));
    local_880._0_4_ = auVar184._0_4_ + fVar98;
    local_880._4_4_ = auVar184._4_4_ + fVar126;
    local_880._8_4_ = auVar184._8_4_ + fVar127;
    local_880._12_4_ = auVar184._12_4_ + fVar128;
    local_880._16_4_ = fVar129 + 0.0;
    local_880._20_4_ = fVar130 + 0.0;
    local_880._24_4_ = fVar131 + 0.0;
    local_880._28_4_ = auVar235._28_4_ + 0.0;
    auVar235 = vsubps_avx(auVar141,auVar15);
    auVar15 = vpermps_avx2(_DAT_01fb7720,auVar235);
    auVar16 = vpermps_avx2(_DAT_01fb7720,auVar141);
    auVar235 = vmaxps_avx(auVar141,local_880);
    auVar11 = vrsqrtps_avx(ZEXT1632(auVar132));
    auVar85 = vmaxps_avx(auVar15,auVar16);
    auVar235 = vmaxps_avx(auVar235,auVar85);
    fVar98 = auVar11._0_4_;
    fVar126 = auVar11._4_4_;
    fVar127 = auVar11._8_4_;
    fVar128 = auVar11._12_4_;
    fVar131 = auVar11._16_4_;
    fVar129 = auVar11._20_4_;
    fVar130 = auVar11._24_4_;
    auVar10._4_4_ = fVar126 * fVar126 * fVar126 * auVar132._4_4_ * -0.5;
    auVar10._0_4_ = fVar98 * fVar98 * fVar98 * auVar132._0_4_ * -0.5;
    auVar10._8_4_ = fVar127 * fVar127 * fVar127 * auVar132._8_4_ * -0.5;
    auVar10._12_4_ = fVar128 * fVar128 * fVar128 * auVar132._12_4_ * -0.5;
    auVar10._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
    auVar10._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
    auVar10._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
    auVar10._28_4_ = local_820._28_4_;
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar8 = vfmadd231ps_fma(auVar10,auVar113,auVar11);
    fVar126 = auVar8._0_4_;
    fVar127 = auVar8._4_4_;
    auVar17._4_4_ = fVar206 * fVar127;
    auVar17._0_4_ = fVar205 * fVar126;
    fVar131 = auVar8._8_4_;
    auVar17._8_4_ = fVar207 * fVar131;
    fVar130 = auVar8._12_4_;
    auVar17._12_4_ = fVar208 * fVar130;
    auVar17._16_4_ = fVar209 * 0.0;
    auVar17._20_4_ = fVar210 * 0.0;
    auVar17._24_4_ = fVar261 * 0.0;
    auVar17._28_4_ = 0;
    auVar18._4_4_ = (float)local_8c0._4_4_ * fVar147 * fVar127;
    auVar18._0_4_ = (float)local_8c0._0_4_ * fVar172 * fVar126;
    auVar18._8_4_ = fStack_8b8 * fVar197 * fVar131;
    auVar18._12_4_ = fStack_8b4 * fVar148 * fVar130;
    auVar18._16_4_ = fStack_8b0 * fVar149 * 0.0;
    auVar18._20_4_ = fStack_8ac * fVar238 * 0.0;
    auVar18._24_4_ = fStack_8a8 * fVar243 * 0.0;
    auVar18._28_4_ = local_2c0._28_4_;
    auVar132 = vfmadd231ps_fma(auVar18,auVar17,_local_8a0);
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,auVar86);
    fVar205 = auVar11._0_4_;
    fVar206 = auVar11._4_4_;
    auVar19._4_4_ = fVar206 * fVar147 * fVar127;
    auVar19._0_4_ = fVar205 * fVar172 * fVar126;
    fVar207 = auVar11._8_4_;
    auVar19._8_4_ = fVar207 * fVar197 * fVar131;
    fVar208 = auVar11._12_4_;
    auVar19._12_4_ = fVar208 * fVar148 * fVar130;
    fVar209 = auVar11._16_4_;
    auVar19._16_4_ = fVar209 * fVar149 * 0.0;
    fVar210 = auVar11._20_4_;
    auVar19._20_4_ = fVar210 * fVar238 * 0.0;
    fVar172 = auVar11._24_4_;
    auVar19._24_4_ = fVar172 * fVar243 * 0.0;
    auVar19._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar227 = ZEXT1632(auVar173);
    auVar12 = vsubps_avx(ZEXT832(0) << 0x20,auVar227);
    auVar100 = vfmadd231ps_fma(auVar19,auVar12,auVar17);
    auVar20._4_4_ = fVar245 * fVar127;
    auVar20._0_4_ = fVar244 * fVar126;
    auVar20._8_4_ = fVar250 * fVar131;
    auVar20._12_4_ = fVar251 * fVar130;
    auVar20._16_4_ = fVar252 * 0.0;
    auVar20._20_4_ = fVar253 * 0.0;
    auVar20._24_4_ = fVar254 * 0.0;
    auVar20._28_4_ = auVar85._28_4_;
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar20,_local_7e0);
    auVar242 = ZEXT1664(auVar132);
    auVar256 = ZEXT832(0) << 0x20;
    auVar89 = vsubps_avx(auVar256,local_a00);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar89,auVar20);
    auVar21._4_4_ = (float)local_8c0._4_4_ * fVar206;
    auVar21._0_4_ = (float)local_8c0._0_4_ * fVar205;
    auVar21._8_4_ = fStack_8b8 * fVar207;
    auVar21._12_4_ = fStack_8b4 * fVar208;
    auVar21._16_4_ = fStack_8b0 * fVar209;
    auVar21._20_4_ = fStack_8ac * fVar210;
    auVar21._24_4_ = fStack_8a8 * fVar172;
    auVar21._28_4_ = auVar85._28_4_;
    auVar72 = vfmadd231ps_fma(auVar21,_local_8a0,auVar12);
    auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),_local_7e0,auVar89);
    fVar98 = auVar100._0_4_;
    fVar238 = auVar132._0_4_;
    fVar128 = auVar100._4_4_;
    fVar243 = auVar132._4_4_;
    fVar129 = auVar100._8_4_;
    fVar244 = auVar132._8_4_;
    fVar197 = auVar100._12_4_;
    fVar245 = auVar132._12_4_;
    auVar22._28_4_ = uStack_8a4;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar245 * fVar197,
                            CONCAT48(fVar244 * fVar129,CONCAT44(fVar243 * fVar128,fVar238 * fVar98))
                           ));
    auVar13 = vsubps_avx(ZEXT1632(auVar72),auVar22);
    auVar23._4_4_ = fVar206 * fVar206;
    auVar23._0_4_ = fVar205 * fVar205;
    auVar23._8_4_ = fVar207 * fVar207;
    auVar23._12_4_ = fVar208 * fVar208;
    auVar23._16_4_ = fVar209 * fVar209;
    auVar23._20_4_ = fVar210 * fVar210;
    auVar23._24_4_ = fVar172 * fVar172;
    auVar23._28_4_ = uStack_8a4;
    auVar72 = vfmadd231ps_fma(auVar23,auVar12,auVar12);
    auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar89,auVar89);
    auVar24._28_4_ = local_2e0._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar197 * fVar197,
                            CONCAT48(fVar129 * fVar129,CONCAT44(fVar128 * fVar128,fVar98 * fVar98)))
                 );
    auVar182 = vsubps_avx(ZEXT1632(auVar72),auVar24);
    auVar85 = vsqrtps_avx(auVar84);
    fVar98 = (auVar235._0_4_ + auVar85._0_4_) * 1.0000002;
    fVar128 = (auVar235._4_4_ + auVar85._4_4_) * 1.0000002;
    fVar129 = (auVar235._8_4_ + auVar85._8_4_) * 1.0000002;
    fVar197 = (auVar235._12_4_ + auVar85._12_4_) * 1.0000002;
    fVar147 = (auVar235._16_4_ + auVar85._16_4_) * 1.0000002;
    fVar148 = (auVar235._20_4_ + auVar85._20_4_) * 1.0000002;
    fVar149 = (auVar235._24_4_ + auVar85._24_4_) * 1.0000002;
    auVar25._4_4_ = fVar128 * fVar128;
    auVar25._0_4_ = fVar98 * fVar98;
    auVar25._8_4_ = fVar129 * fVar129;
    auVar25._12_4_ = fVar197 * fVar197;
    auVar25._16_4_ = fVar147 * fVar147;
    auVar25._20_4_ = fVar148 * fVar148;
    auVar25._24_4_ = fVar149 * fVar149;
    auVar25._28_4_ = auVar235._28_4_ + auVar85._28_4_;
    fVar128 = auVar13._0_4_ + auVar13._0_4_;
    fVar129 = auVar13._4_4_ + auVar13._4_4_;
    local_340._0_8_ = CONCAT44(fVar129,fVar128);
    local_340._8_4_ = auVar13._8_4_ + auVar13._8_4_;
    local_340._12_4_ = auVar13._12_4_ + auVar13._12_4_;
    local_340._16_4_ = auVar13._16_4_ + auVar13._16_4_;
    local_340._20_4_ = auVar13._20_4_ + auVar13._20_4_;
    local_340._24_4_ = auVar13._24_4_ + auVar13._24_4_;
    fVar98 = auVar13._28_4_;
    local_340._28_4_ = fVar98 + fVar98;
    auVar235 = vsubps_avx(auVar182,auVar25);
    auVar239 = ZEXT1632(auVar132);
    local_320._28_4_ = auVar182._28_4_;
    local_320._0_28_ =
         ZEXT1628(CONCAT412(fVar245 * fVar245,
                            CONCAT48(fVar244 * fVar244,CONCAT44(fVar243 * fVar243,fVar238 * fVar238)
                                    )));
    auVar13 = vsubps_avx(local_260,local_320);
    auVar26._4_4_ = fVar129 * fVar129;
    auVar26._0_4_ = fVar128 * fVar128;
    auVar26._8_4_ = local_340._8_4_ * local_340._8_4_;
    auVar26._12_4_ = local_340._12_4_ * local_340._12_4_;
    auVar26._16_4_ = local_340._16_4_ * local_340._16_4_;
    auVar26._20_4_ = local_340._20_4_ * local_340._20_4_;
    auVar26._24_4_ = local_340._24_4_ * local_340._24_4_;
    auVar26._28_4_ = fVar98;
    fVar98 = auVar13._0_4_;
    fVar128 = auVar13._4_4_;
    fVar129 = auVar13._8_4_;
    fVar197 = auVar13._12_4_;
    fVar147 = auVar13._16_4_;
    fVar148 = auVar13._20_4_;
    fVar149 = auVar13._24_4_;
    auVar27._4_4_ = fVar128 * 4.0 * auVar235._4_4_;
    auVar27._0_4_ = fVar98 * 4.0 * auVar235._0_4_;
    auVar27._8_4_ = fVar129 * 4.0 * auVar235._8_4_;
    auVar27._12_4_ = fVar197 * 4.0 * auVar235._12_4_;
    auVar27._16_4_ = fVar147 * 4.0 * auVar235._16_4_;
    auVar27._20_4_ = fVar148 * 4.0 * auVar235._20_4_;
    auVar27._24_4_ = fVar149 * 4.0 * auVar235._24_4_;
    auVar27._28_4_ = 0x40800000;
    auVar167 = vsubps_avx(auVar26,auVar27);
    auVar84 = vcmpps_avx(auVar167,auVar256,5);
    local_360._0_4_ = fVar98 + fVar98;
    local_360._4_4_ = fVar128 + fVar128;
    local_360._8_4_ = fVar129 + fVar129;
    local_360._12_4_ = fVar197 + fVar197;
    local_360._16_4_ = fVar147 + fVar147;
    local_360._20_4_ = fVar148 + fVar148;
    local_360._24_4_ = fVar149 + fVar149;
    local_360._28_4_ = auVar13._28_4_ + auVar13._28_4_;
    auVar269 = ZEXT1632(auVar100);
    if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar84 >> 0x7f,0) == '\0') &&
          (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar84 >> 0xbf,0) == '\0') &&
        (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar84[0x1f]) {
      auVar216._8_4_ = 0x7f800000;
      auVar216._0_8_ = 0x7f8000007f800000;
      auVar216._12_4_ = 0x7f800000;
      auVar216._16_4_ = 0x7f800000;
      auVar216._20_4_ = 0x7f800000;
      auVar216._24_4_ = 0x7f800000;
      auVar216._28_4_ = 0x7f800000;
      auVar88._8_4_ = 0xff800000;
      auVar88._0_8_ = 0xff800000ff800000;
      auVar88._12_4_ = 0xff800000;
      auVar88._16_4_ = 0xff800000;
      auVar88._20_4_ = 0xff800000;
      auVar88._24_4_ = 0xff800000;
      auVar88._28_4_ = 0xff800000;
    }
    else {
      auVar10 = vsqrtps_avx(auVar167);
      auVar256 = vcmpps_avx(auVar167,auVar256,5);
      auVar167 = vrcpps_avx(local_360);
      auVar217._8_4_ = 0x3f800000;
      auVar217._0_8_ = 0x3f8000003f800000;
      auVar217._12_4_ = 0x3f800000;
      auVar217._16_4_ = 0x3f800000;
      auVar217._20_4_ = 0x3f800000;
      auVar217._24_4_ = 0x3f800000;
      auVar217._28_4_ = 0x3f800000;
      auVar132 = vfnmadd213ps_fma(auVar167,local_360,auVar217);
      auVar132 = vfmadd132ps_fma(ZEXT1632(auVar132),auVar167,auVar167);
      auVar265._0_8_ = local_340._0_8_ ^ 0x8000000080000000;
      auVar265._8_4_ = -local_340._8_4_;
      auVar265._12_4_ = -local_340._12_4_;
      auVar265._16_4_ = -local_340._16_4_;
      auVar265._20_4_ = -local_340._20_4_;
      auVar265._24_4_ = -local_340._24_4_;
      auVar265._28_4_ = -local_340._28_4_;
      auVar167 = vsubps_avx(auVar265,auVar10);
      auVar28._4_4_ = auVar167._4_4_ * auVar132._4_4_;
      auVar28._0_4_ = auVar167._0_4_ * auVar132._0_4_;
      auVar28._8_4_ = auVar167._8_4_ * auVar132._8_4_;
      auVar28._12_4_ = auVar167._12_4_ * auVar132._12_4_;
      auVar28._16_4_ = auVar167._16_4_ * 0.0;
      auVar28._20_4_ = auVar167._20_4_ * 0.0;
      auVar28._24_4_ = auVar167._24_4_ * 0.0;
      auVar28._28_4_ = auVar167._28_4_;
      auVar167 = vsubps_avx(auVar10,local_340);
      auVar248._0_4_ = auVar132._0_4_ * auVar167._0_4_;
      auVar248._4_4_ = auVar132._4_4_ * auVar167._4_4_;
      auVar248._8_4_ = auVar132._8_4_ * auVar167._8_4_;
      auVar248._12_4_ = auVar132._12_4_ * auVar167._12_4_;
      auVar248._16_4_ = auVar167._16_4_ * 0.0;
      auVar248._20_4_ = auVar167._20_4_ * 0.0;
      auVar248._24_4_ = auVar167._24_4_ * 0.0;
      auVar248._28_4_ = 0;
      auVar132 = vfmadd213ps_fma(auVar239,auVar28,auVar269);
      local_3e0 = fVar126 * auVar132._0_4_;
      fStack_3dc = fVar127 * auVar132._4_4_;
      fStack_3d8 = fVar131 * auVar132._8_4_;
      fStack_3d4 = fVar130 * auVar132._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      uStack_3c4 = 0x80000000;
      auVar167 = vandps_avx(local_8e0,local_320);
      auVar167 = vmaxps_avx(local_6c0,auVar167);
      auVar29._4_4_ = auVar167._4_4_ * 1.9073486e-06;
      auVar29._0_4_ = auVar167._0_4_ * 1.9073486e-06;
      auVar29._8_4_ = auVar167._8_4_ * 1.9073486e-06;
      auVar29._12_4_ = auVar167._12_4_ * 1.9073486e-06;
      auVar29._16_4_ = auVar167._16_4_ * 1.9073486e-06;
      auVar29._20_4_ = auVar167._20_4_ * 1.9073486e-06;
      auVar29._24_4_ = auVar167._24_4_ * 1.9073486e-06;
      auVar29._28_4_ = auVar167._28_4_;
      auVar167 = vandps_avx(auVar13,local_8e0);
      auVar167 = vcmpps_avx(auVar167,auVar29,1);
      auVar132 = vfmadd213ps_fma(auVar239,auVar248,auVar269);
      auVar218._8_4_ = 0x7f800000;
      auVar218._0_8_ = 0x7f8000007f800000;
      auVar218._12_4_ = 0x7f800000;
      auVar218._16_4_ = 0x7f800000;
      auVar218._20_4_ = 0x7f800000;
      auVar218._24_4_ = 0x7f800000;
      auVar218._28_4_ = 0x7f800000;
      auVar216 = vblendvps_avx(auVar218,auVar28,auVar256);
      local_400 = fVar126 * auVar132._0_4_;
      fStack_3fc = fVar127 * auVar132._4_4_;
      fStack_3f8 = fVar131 * auVar132._8_4_;
      fStack_3f4 = fVar130 * auVar132._12_4_;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      uStack_3e4 = 0x80000000;
      auVar257._8_4_ = 0xff800000;
      auVar257._0_8_ = 0xff800000ff800000;
      auVar257._12_4_ = 0xff800000;
      auVar257._16_4_ = 0xff800000;
      auVar257._20_4_ = 0xff800000;
      auVar257._24_4_ = 0xff800000;
      auVar257._28_4_ = 0xff800000;
      auVar88 = vblendvps_avx(auVar257,auVar248,auVar256);
      auVar10 = auVar256 & auVar167;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar167,auVar256);
        auVar167 = vcmpps_avx(auVar235,_DAT_01f7b000,2);
        auVar267._8_4_ = 0xff800000;
        auVar267._0_8_ = 0xff800000ff800000;
        auVar267._12_4_ = 0xff800000;
        auVar267._16_4_ = 0xff800000;
        auVar267._20_4_ = 0xff800000;
        auVar267._24_4_ = 0xff800000;
        auVar267._28_4_ = 0xff800000;
        auVar223._8_4_ = 0x7f800000;
        auVar223._0_8_ = 0x7f8000007f800000;
        auVar223._12_4_ = 0x7f800000;
        auVar223._16_4_ = 0x7f800000;
        auVar223._20_4_ = 0x7f800000;
        auVar223._24_4_ = 0x7f800000;
        auVar223._28_4_ = 0x7f800000;
        auVar235 = vblendvps_avx(auVar223,auVar267,auVar167);
        auVar132 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar132);
        auVar216 = vblendvps_avx(auVar216,auVar235,auVar10);
        auVar235 = vblendvps_avx(auVar267,auVar223,auVar167);
        auVar88 = vblendvps_avx(auVar88,auVar235,auVar10);
        auVar145._0_8_ = auVar84._0_8_ ^ 0xffffffffffffffff;
        auVar145._8_4_ = auVar84._8_4_ ^ 0xffffffff;
        auVar145._12_4_ = auVar84._12_4_ ^ 0xffffffff;
        auVar145._16_4_ = auVar84._16_4_ ^ 0xffffffff;
        auVar145._20_4_ = auVar84._20_4_ ^ 0xffffffff;
        auVar145._24_4_ = auVar84._24_4_ ^ 0xffffffff;
        auVar145._28_4_ = auVar84._28_4_ ^ 0xffffffff;
        auVar84 = vorps_avx(auVar167,auVar145);
        auVar84 = vandps_avx(auVar256,auVar84);
      }
    }
    uStack_7e4 = 0x80000000;
    uStack_7e8 = 0x80000000;
    uStack_7ec = 0x80000000;
    uStack_7f0 = 0x80000000;
    uStack_7f4 = 0x80000000;
    uStack_7f8 = 0x80000000;
    uStack_7fc = 0x80000000;
    local_800 = 0x80000000;
    auVar232 = ZEXT1664(auVar8);
    auVar249 = ZEXT3264(CONCAT824(uStack_a08,CONCAT816(uStack_a10,CONCAT88(uStack_a18,local_a20))));
    auVar235 = local_660 & auVar84;
    if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar235 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar235 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar235 >> 0x7f,0) == '\0') &&
          (auVar235 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar235 >> 0xbf,0) == '\0') &&
        (auVar235 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar235[0x1f])
    {
LAB_0119b672:
      auVar259 = ZEXT3264(local_9e0);
      auVar270 = ZEXT3264(local_a80);
      fVar98 = (float)local_940._0_4_;
      fVar126 = (float)local_940._4_4_;
      fVar127 = fStack_938;
      fVar128 = fStack_934;
      fVar131 = fStack_930;
      fVar129 = fStack_92c;
      fVar130 = fStack_928;
      fVar197 = fStack_924;
    }
    else {
      local_420 = ZEXT1632(auVar8);
      auVar232 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      fVar238 = *(float *)(ray + k * 4 + 0x100) - (float)local_970._0_4_;
      auVar193._4_4_ = fVar238;
      auVar193._0_4_ = fVar238;
      auVar193._8_4_ = fVar238;
      auVar193._12_4_ = fVar238;
      auVar193._16_4_ = fVar238;
      auVar193._20_4_ = fVar238;
      auVar193._24_4_ = fVar238;
      auVar193._28_4_ = fVar238;
      auVar167 = vminps_avx(auVar193,auVar88);
      auVar30._4_4_ = fVar206 * auVar236._4_4_;
      auVar30._0_4_ = fVar205 * auVar236._0_4_;
      auVar30._8_4_ = fVar207 * auVar236._8_4_;
      auVar30._12_4_ = fVar208 * auVar236._12_4_;
      auVar30._16_4_ = fVar209 * auVar236._16_4_;
      auVar30._20_4_ = fVar210 * auVar236._20_4_;
      auVar30._24_4_ = fVar172 * auVar236._24_4_;
      auVar30._28_4_ = auVar11._28_4_;
      auVar8 = vfmadd213ps_fma(auVar12,local_aa0,auVar30);
      auVar54._4_4_ = fStack_3bc;
      auVar54._0_4_ = local_3c0;
      auVar54._8_4_ = fStack_3b8;
      auVar54._12_4_ = fStack_3b4;
      auVar54._16_4_ = fStack_3b0;
      auVar54._20_4_ = fStack_3ac;
      auVar54._24_4_ = fStack_3a8;
      auVar54._28_4_ = fStack_3a4;
      auVar12 = vmaxps_avx(auVar54,auVar216);
      auVar132 = vfmadd213ps_fma(auVar89,local_a60,ZEXT1632(auVar8));
      auVar31._4_4_ = auVar236._4_4_ * (float)local_8c0._4_4_;
      auVar31._0_4_ = auVar236._0_4_ * (float)local_8c0._0_4_;
      auVar31._8_4_ = auVar236._8_4_ * fStack_8b8;
      auVar31._12_4_ = auVar236._12_4_ * fStack_8b4;
      auVar31._16_4_ = auVar236._16_4_ * fStack_8b0;
      auVar31._20_4_ = auVar236._20_4_ * fStack_8ac;
      auVar31._24_4_ = auVar236._24_4_ * fStack_8a8;
      auVar31._28_4_ = 0;
      auVar8 = vfmadd231ps_fma(auVar31,local_aa0,_local_8a0);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_7e0,local_a60);
      auVar235 = vandps_avx(ZEXT1632(auVar100),local_8e0);
      auVar219._8_4_ = 0x219392ef;
      auVar219._0_8_ = 0x219392ef219392ef;
      auVar219._12_4_ = 0x219392ef;
      auVar219._16_4_ = 0x219392ef;
      auVar219._20_4_ = 0x219392ef;
      auVar219._24_4_ = 0x219392ef;
      auVar219._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar235,auVar219,1);
      auVar235 = vrcpps_avx(ZEXT1632(auVar100));
      auVar220._8_4_ = 0x3f800000;
      auVar220._0_8_ = 0x3f8000003f800000;
      auVar220._12_4_ = 0x3f800000;
      auVar220._16_4_ = 0x3f800000;
      auVar220._20_4_ = 0x3f800000;
      auVar220._24_4_ = 0x3f800000;
      auVar220._28_4_ = 0x3f800000;
      auVar89 = ZEXT1632(auVar100);
      auVar8 = vfnmadd213ps_fma(auVar235,auVar89,auVar220);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar235,auVar235);
      auVar202._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
      auVar202._8_4_ = auVar100._8_4_ ^ 0x80000000;
      auVar202._12_4_ = auVar100._12_4_ ^ 0x80000000;
      auVar202._16_4_ = 0x80000000;
      auVar202._20_4_ = 0x80000000;
      auVar202._24_4_ = 0x80000000;
      auVar202._28_4_ = 0x80000000;
      auVar32._4_4_ = auVar8._4_4_ * -auVar132._4_4_;
      auVar32._0_4_ = auVar8._0_4_ * -auVar132._0_4_;
      auVar32._8_4_ = auVar8._8_4_ * -auVar132._8_4_;
      auVar32._12_4_ = auVar8._12_4_ * -auVar132._12_4_;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      auVar235 = vcmpps_avx(auVar89,auVar202,1);
      auVar235 = vorps_avx(auVar235,auVar11);
      auVar258._8_4_ = 0xff800000;
      auVar258._0_8_ = 0xff800000ff800000;
      auVar258._12_4_ = 0xff800000;
      auVar258._16_4_ = 0xff800000;
      auVar258._20_4_ = 0xff800000;
      auVar258._24_4_ = 0xff800000;
      auVar258._28_4_ = 0xff800000;
      auVar235 = vblendvps_avx(auVar32,auVar258,auVar235);
      auVar12 = vmaxps_avx(auVar12,auVar235);
      auVar235 = vcmpps_avx(auVar89,auVar202,6);
      auVar235 = vorps_avx(auVar11,auVar235);
      auVar266._8_4_ = 0x7f800000;
      auVar266._0_8_ = 0x7f8000007f800000;
      auVar266._12_4_ = 0x7f800000;
      auVar266._16_4_ = 0x7f800000;
      auVar266._20_4_ = 0x7f800000;
      auVar266._24_4_ = 0x7f800000;
      auVar266._28_4_ = 0x7f800000;
      auVar235 = vblendvps_avx(auVar32,auVar266,auVar235);
      auVar89 = vminps_avx(auVar167,auVar235);
      fVar205 = -local_ae0._0_4_;
      fVar206 = -local_ae0._4_4_;
      fVar207 = -local_ae0._8_4_;
      fVar208 = -local_ae0._12_4_;
      fVar209 = -local_ae0._16_4_;
      fVar210 = -local_ae0._20_4_;
      fVar172 = -local_ae0._24_4_;
      auVar181._0_8_ = local_820._0_8_ ^ 0x8000000080000000;
      auVar181._8_4_ = -local_820._8_4_;
      auVar181._12_4_ = -local_820._12_4_;
      auVar181._16_4_ = -local_820._16_4_;
      auVar181._20_4_ = -local_820._20_4_;
      auVar181._24_4_ = -local_820._24_4_;
      auVar181._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar235 = vsubps_avx(ZEXT832(0) << 0x20,auVar14);
      auVar11 = vsubps_avx(ZEXT832(0) << 0x20,auVar204);
      auVar33._4_4_ = auVar11._4_4_ * fVar206;
      auVar33._0_4_ = auVar11._0_4_ * fVar205;
      auVar33._8_4_ = auVar11._8_4_ * fVar207;
      auVar33._12_4_ = auVar11._12_4_ * fVar208;
      auVar33._16_4_ = auVar11._16_4_ * fVar209;
      auVar33._20_4_ = auVar11._20_4_ * fVar210;
      auVar33._24_4_ = auVar11._24_4_ * fVar172;
      auVar33._28_4_ = auVar11._28_4_;
      auVar8 = vfmadd231ps_fma(auVar33,auVar181,auVar235);
      auVar194._0_8_ = local_ac0._0_8_ ^ 0x8000000080000000;
      auVar194._8_4_ = -local_ac0._8_4_;
      auVar194._12_4_ = -local_ac0._12_4_;
      auVar194._16_4_ = -local_ac0._16_4_;
      auVar194._20_4_ = -local_ac0._20_4_;
      auVar194._24_4_ = -local_ac0._24_4_;
      auVar194._28_4_ = local_ac0._28_4_ ^ 0x80000000;
      auVar235 = vsubps_avx(ZEXT832(0) << 0x20,auVar166);
      auVar132 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar194,auVar235);
      auVar34._4_4_ = fVar206 * (float)local_8c0._4_4_;
      auVar34._0_4_ = fVar205 * (float)local_8c0._0_4_;
      auVar34._8_4_ = fVar207 * fStack_8b8;
      auVar34._12_4_ = fVar208 * fStack_8b4;
      auVar34._16_4_ = fVar209 * fStack_8b0;
      auVar34._20_4_ = fVar210 * fStack_8ac;
      auVar34._24_4_ = fVar172 * fStack_8a8;
      auVar34._28_4_ = local_ae0._28_4_ ^ 0x80000000;
      auVar8 = vfmadd231ps_fma(auVar34,auVar181,_local_8a0);
      auVar100 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_7e0,auVar194);
      auVar235 = vandps_avx(ZEXT1632(auVar100),local_8e0);
      auVar167 = vrcpps_avx(ZEXT1632(auVar100));
      auVar114._8_4_ = 0x219392ef;
      auVar114._0_8_ = 0x219392ef219392ef;
      auVar114._12_4_ = 0x219392ef;
      auVar114._16_4_ = 0x219392ef;
      auVar114._20_4_ = 0x219392ef;
      auVar114._24_4_ = 0x219392ef;
      auVar114._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar235,auVar114,1);
      auVar166 = ZEXT1632(auVar100);
      auVar8 = vfnmadd213ps_fma(auVar167,auVar166,auVar220);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar167,auVar167);
      auVar195._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
      auVar195._8_4_ = auVar100._8_4_ ^ 0x80000000;
      auVar195._12_4_ = auVar100._12_4_ ^ 0x80000000;
      auVar195._16_4_ = 0x80000000;
      auVar195._20_4_ = 0x80000000;
      auVar195._24_4_ = 0x80000000;
      auVar195._28_4_ = 0x80000000;
      auVar35._4_4_ = auVar8._4_4_ * -auVar132._4_4_;
      auVar35._0_4_ = auVar8._0_4_ * -auVar132._0_4_;
      auVar35._8_4_ = auVar8._8_4_ * -auVar132._8_4_;
      auVar35._12_4_ = auVar8._12_4_ * -auVar132._12_4_;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      auVar235 = vcmpps_avx(auVar166,auVar195,1);
      auVar235 = vorps_avx(auVar235,auVar11);
      auVar115._8_4_ = 0xff800000;
      auVar115._0_8_ = 0xff800000ff800000;
      auVar115._12_4_ = 0xff800000;
      auVar115._16_4_ = 0xff800000;
      auVar115._20_4_ = 0xff800000;
      auVar115._24_4_ = 0xff800000;
      auVar115._28_4_ = 0xff800000;
      auVar235 = vblendvps_avx(auVar35,auVar115,auVar235);
      auVar12 = vmaxps_avx(auVar12,auVar235);
      auVar235 = vcmpps_avx(auVar166,auVar195,6);
      auVar235 = vorps_avx(auVar11,auVar235);
      auVar235 = vblendvps_avx(auVar35,auVar266,auVar235);
      auVar84 = vandps_avx(auVar84,local_660);
      local_440 = vminps_avx(auVar89,auVar235);
      auVar235 = vcmpps_avx(auVar12,local_440,2);
      auVar11 = auVar84 & auVar235;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0x7f,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar11 >> 0xbf,0) == '\0') &&
          (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar11[0x1f])
      {
        auVar249 = ZEXT3264(CONCAT824(uStack_a08,
                                      CONCAT816(uStack_a10,CONCAT88(uStack_a18,local_a20))));
        goto LAB_0119b672;
      }
      auVar53._4_4_ = fStack_3dc;
      auVar53._0_4_ = local_3e0;
      auVar53._8_4_ = fStack_3d8;
      auVar53._12_4_ = fStack_3d4;
      auVar53._16_4_ = uStack_3d0;
      auVar53._20_4_ = uStack_3cc;
      auVar53._24_4_ = uStack_3c8;
      auVar53._28_4_ = uStack_3c4;
      auVar203._8_4_ = 0x3f800000;
      auVar203._0_8_ = 0x3f8000003f800000;
      auVar203._12_4_ = 0x3f800000;
      auVar203._16_4_ = 0x3f800000;
      auVar203._20_4_ = 0x3f800000;
      auVar203._24_4_ = 0x3f800000;
      auVar203._28_4_ = 0x3f800000;
      auVar11 = vminps_avx(auVar53,auVar203);
      auVar167 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar11 = vmaxps_avx(auVar11,ZEXT832(0) << 0x20);
      auVar52._4_4_ = fStack_3fc;
      auVar52._0_4_ = local_400;
      auVar52._8_4_ = fStack_3f8;
      auVar52._12_4_ = fStack_3f4;
      auVar52._16_4_ = uStack_3f0;
      auVar52._20_4_ = uStack_3ec;
      auVar52._24_4_ = uStack_3e8;
      auVar52._28_4_ = uStack_3e4;
      auVar89 = vminps_avx(auVar52,auVar203);
      auVar89 = vmaxps_avx(auVar89,ZEXT832(0) << 0x20);
      auVar36._4_4_ = (auVar11._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar11._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar11._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar11._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar11._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar11._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar11._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar11._28_4_ + 7.0;
      auVar8 = vfmadd213ps_fma(auVar36,local_860,local_840);
      auVar37._4_4_ = (auVar89._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar89._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar89._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar89._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar89._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar89._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar89._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar89._28_4_ + 7.0;
      auVar132 = vfmadd213ps_fma(auVar37,local_860,local_840);
      auVar11 = vminps_avx(auVar141,local_880);
      auVar89 = vminps_avx(auVar15,auVar16);
      auVar11 = vminps_avx(auVar11,auVar89);
      auVar85 = vsubps_avx(auVar11,auVar85);
      auVar84 = vandps_avx(auVar235,auVar84);
      local_1a0 = ZEXT1632(auVar8);
      local_1c0 = ZEXT1632(auVar132);
      auVar38._4_4_ = auVar85._4_4_ * 0.99999976;
      auVar38._0_4_ = auVar85._0_4_ * 0.99999976;
      auVar38._8_4_ = auVar85._8_4_ * 0.99999976;
      auVar38._12_4_ = auVar85._12_4_ * 0.99999976;
      auVar38._16_4_ = auVar85._16_4_ * 0.99999976;
      auVar38._20_4_ = auVar85._20_4_ * 0.99999976;
      auVar38._24_4_ = auVar85._24_4_ * 0.99999976;
      auVar38._28_4_ = auVar235._28_4_;
      auVar235 = vmaxps_avx(ZEXT832(0) << 0x20,auVar38);
      auVar39._4_4_ = auVar235._4_4_ * auVar235._4_4_;
      auVar39._0_4_ = auVar235._0_4_ * auVar235._0_4_;
      auVar39._8_4_ = auVar235._8_4_ * auVar235._8_4_;
      auVar39._12_4_ = auVar235._12_4_ * auVar235._12_4_;
      auVar39._16_4_ = auVar235._16_4_ * auVar235._16_4_;
      auVar39._20_4_ = auVar235._20_4_ * auVar235._20_4_;
      auVar39._24_4_ = auVar235._24_4_ * auVar235._24_4_;
      auVar39._28_4_ = auVar235._28_4_;
      auVar85 = vsubps_avx(auVar182,auVar39);
      auVar40._4_4_ = auVar85._4_4_ * fVar128 * 4.0;
      auVar40._0_4_ = auVar85._0_4_ * fVar98 * 4.0;
      auVar40._8_4_ = auVar85._8_4_ * fVar129 * 4.0;
      auVar40._12_4_ = auVar85._12_4_ * fVar197 * 4.0;
      auVar40._16_4_ = auVar85._16_4_ * fVar147 * 4.0;
      auVar40._20_4_ = auVar85._20_4_ * fVar148 * 4.0;
      auVar40._24_4_ = auVar85._24_4_ * fVar149 * 4.0;
      auVar40._28_4_ = auVar235._28_4_;
      auVar11 = vsubps_avx(auVar26,auVar40);
      local_9c0 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
      auVar235 = local_9c0;
      if ((((((((local_9c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_9c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_9c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_9c0 >> 0x7f,0) == '\0') &&
            (local_9c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_9c0 >> 0xbf,0) == '\0') &&
          (local_9c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_9c0[0x1f]) {
        auVar204 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar191 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar182 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar166 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_ce0 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar221._8_4_ = 0x7f800000;
        auVar221._0_8_ = 0x7f8000007f800000;
        auVar221._12_4_ = 0x7f800000;
        auVar221._16_4_ = 0x7f800000;
        auVar221._20_4_ = 0x7f800000;
        auVar221._24_4_ = 0x7f800000;
        auVar221._28_4_ = 0x7f800000;
        auVar240._8_4_ = 0xff800000;
        auVar240._0_8_ = 0xff800000ff800000;
        auVar240._12_4_ = 0xff800000;
        auVar240._16_4_ = 0xff800000;
        auVar240._20_4_ = 0xff800000;
        auVar240._24_4_ = 0xff800000;
        auVar240._28_4_ = 0xff800000;
        local_9c0 = auVar14;
      }
      else {
        auVar89 = vrcpps_avx(local_360);
        auVar168._8_4_ = 0x3f800000;
        auVar168._0_8_ = 0x3f8000003f800000;
        auVar168._12_4_ = 0x3f800000;
        auVar168._16_4_ = 0x3f800000;
        auVar168._20_4_ = 0x3f800000;
        auVar168._24_4_ = 0x3f800000;
        auVar168._28_4_ = 0x3f800000;
        auVar8 = vfnmadd213ps_fma(local_360,auVar89,auVar168);
        auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar89,auVar89);
        auVar89 = vsqrtps_avx(auVar11);
        auVar169._0_8_ = local_340._0_8_ ^ 0x8000000080000000;
        auVar169._8_4_ = -local_340._8_4_;
        auVar169._12_4_ = -local_340._12_4_;
        auVar169._16_4_ = -local_340._16_4_;
        auVar169._20_4_ = -local_340._20_4_;
        auVar169._24_4_ = -local_340._24_4_;
        auVar169._28_4_ = -local_340._28_4_;
        auVar182 = vsubps_avx(auVar169,auVar89);
        auVar167 = vsubps_avx(auVar89,local_340);
        fVar98 = auVar182._0_4_ * auVar8._0_4_;
        fVar128 = auVar182._4_4_ * auVar8._4_4_;
        auVar41._4_4_ = fVar128;
        auVar41._0_4_ = fVar98;
        fVar129 = auVar182._8_4_ * auVar8._8_4_;
        auVar41._8_4_ = fVar129;
        fVar197 = auVar182._12_4_ * auVar8._12_4_;
        auVar41._12_4_ = fVar197;
        fVar205 = auVar182._16_4_ * 0.0;
        auVar41._16_4_ = fVar205;
        fVar206 = auVar182._20_4_ * 0.0;
        auVar41._20_4_ = fVar206;
        fVar207 = auVar182._24_4_ * 0.0;
        auVar41._24_4_ = fVar207;
        auVar41._28_4_ = auVar89._28_4_;
        fVar208 = auVar167._0_4_ * auVar8._0_4_;
        fVar209 = auVar167._4_4_ * auVar8._4_4_;
        auVar42._4_4_ = fVar209;
        auVar42._0_4_ = fVar208;
        fVar210 = auVar167._8_4_ * auVar8._8_4_;
        auVar42._8_4_ = fVar210;
        fVar172 = auVar167._12_4_ * auVar8._12_4_;
        auVar42._12_4_ = fVar172;
        fVar147 = auVar167._16_4_ * 0.0;
        auVar42._16_4_ = fVar147;
        fVar148 = auVar167._20_4_ * 0.0;
        auVar42._20_4_ = fVar148;
        fVar149 = auVar167._24_4_ * 0.0;
        auVar42._24_4_ = fVar149;
        auVar42._28_4_ = local_840._0_4_;
        auVar8 = vfmadd213ps_fma(auVar239,auVar41,auVar269);
        auVar132 = vfmadd213ps_fma(auVar239,auVar42,auVar269);
        auVar182 = ZEXT1632(CONCAT412(fVar130 * auVar8._12_4_,
                                      CONCAT48(fVar131 * auVar8._8_4_,
                                               CONCAT44(fVar127 * auVar8._4_4_,
                                                        fVar126 * auVar8._0_4_))));
        auVar89 = ZEXT1632(CONCAT412(auVar132._12_4_ * fVar130,
                                     CONCAT48(auVar132._8_4_ * fVar131,
                                              CONCAT44(auVar132._4_4_ * fVar127,
                                                       auVar132._0_4_ * fVar126))));
        auVar8 = vfmadd213ps_fma(local_2e0,auVar182,local_a00);
        auVar132 = vfmadd213ps_fma(local_2e0,auVar89,local_a00);
        auVar100 = vfmadd213ps_fma(local_300,auVar182,auVar227);
        auVar72 = vfmadd213ps_fma(local_300,auVar89,auVar227);
        auVar133 = vfmadd213ps_fma(auVar182,local_2c0,auVar86);
        auVar150 = vfmadd213ps_fma(local_2c0,auVar89,auVar86);
        auVar43._4_4_ = (float)local_7e0._4_4_ * fVar128;
        auVar43._0_4_ = (float)local_7e0._0_4_ * fVar98;
        auVar43._8_4_ = fStack_7d8 * fVar129;
        auVar43._12_4_ = fStack_7d4 * fVar197;
        auVar43._16_4_ = fStack_7d0 * fVar205;
        auVar43._20_4_ = fStack_7cc * fVar206;
        auVar43._24_4_ = fStack_7c8 * fVar207;
        auVar43._28_4_ = 0;
        auVar182 = vsubps_avx(auVar43,ZEXT1632(auVar8));
        auVar196._0_4_ = (float)local_8a0._0_4_ * fVar98;
        auVar196._4_4_ = (float)local_8a0._4_4_ * fVar128;
        auVar196._8_4_ = fStack_898 * fVar129;
        auVar196._12_4_ = fStack_894 * fVar197;
        auVar196._16_4_ = fStack_890 * fVar205;
        auVar196._20_4_ = fStack_88c * fVar206;
        auVar196._24_4_ = fStack_888 * fVar207;
        auVar196._28_4_ = 0;
        auVar166 = vsubps_avx(auVar196,ZEXT1632(auVar100));
        auVar44._4_4_ = (float)local_8c0._4_4_ * fVar128;
        auVar44._0_4_ = (float)local_8c0._0_4_ * fVar98;
        auVar44._8_4_ = fStack_8b8 * fVar129;
        auVar44._12_4_ = fStack_8b4 * fVar197;
        auVar44._16_4_ = fStack_8b0 * fVar205;
        auVar44._20_4_ = fStack_8ac * fVar206;
        auVar44._24_4_ = fStack_8a8 * fVar207;
        auVar44._28_4_ = 0;
        auVar89 = vsubps_avx(auVar44,ZEXT1632(auVar133));
        _local_ce0 = auVar89._0_28_;
        auVar45._4_4_ = fVar209 * (float)local_7e0._4_4_;
        auVar45._0_4_ = fVar208 * (float)local_7e0._0_4_;
        auVar45._8_4_ = fVar210 * fStack_7d8;
        auVar45._12_4_ = fVar172 * fStack_7d4;
        auVar45._16_4_ = fVar147 * fStack_7d0;
        auVar45._20_4_ = fVar148 * fStack_7cc;
        auVar45._24_4_ = fVar149 * fStack_7c8;
        auVar45._28_4_ = auVar89._28_4_;
        auVar167 = vsubps_avx(auVar45,ZEXT1632(auVar132));
        auVar46._4_4_ = (float)local_8a0._4_4_ * fVar209;
        auVar46._0_4_ = (float)local_8a0._0_4_ * fVar208;
        auVar46._8_4_ = fStack_898 * fVar210;
        auVar46._12_4_ = fStack_894 * fVar172;
        auVar46._16_4_ = fStack_890 * fVar147;
        auVar46._20_4_ = fStack_88c * fVar148;
        auVar46._24_4_ = fStack_888 * fVar149;
        auVar46._28_4_ = 0;
        auVar204 = vsubps_avx(auVar46,ZEXT1632(auVar72));
        auVar47._4_4_ = (float)local_8c0._4_4_ * fVar209;
        auVar47._0_4_ = (float)local_8c0._0_4_ * fVar208;
        auVar47._8_4_ = fStack_8b8 * fVar210;
        auVar47._12_4_ = fStack_8b4 * fVar172;
        auVar47._16_4_ = fStack_8b0 * fVar147;
        auVar47._20_4_ = fStack_8ac * fVar148;
        auVar47._24_4_ = fStack_8a8 * fVar149;
        auVar47._28_4_ = 0;
        auVar89 = vsubps_avx(auVar47,ZEXT1632(auVar150));
        auVar191 = auVar89._0_28_;
        auVar89 = vcmpps_avx(auVar11,_DAT_01f7b000,5);
        auVar222._8_4_ = 0x7f800000;
        auVar222._0_8_ = 0x7f8000007f800000;
        auVar222._12_4_ = 0x7f800000;
        auVar222._16_4_ = 0x7f800000;
        auVar222._20_4_ = 0x7f800000;
        auVar222._24_4_ = 0x7f800000;
        auVar222._28_4_ = 0x7f800000;
        auVar221 = vblendvps_avx(auVar222,auVar41,auVar89);
        auVar11 = vandps_avx(local_8e0,local_320);
        auVar11 = vmaxps_avx(local_6c0,auVar11);
        auVar48._4_4_ = auVar11._4_4_ * 1.9073486e-06;
        auVar48._0_4_ = auVar11._0_4_ * 1.9073486e-06;
        auVar48._8_4_ = auVar11._8_4_ * 1.9073486e-06;
        auVar48._12_4_ = auVar11._12_4_ * 1.9073486e-06;
        auVar48._16_4_ = auVar11._16_4_ * 1.9073486e-06;
        auVar48._20_4_ = auVar11._20_4_ * 1.9073486e-06;
        auVar48._24_4_ = auVar11._24_4_ * 1.9073486e-06;
        auVar48._28_4_ = auVar11._28_4_;
        auVar11 = vandps_avx(local_8e0,auVar13);
        auVar11 = vcmpps_avx(auVar11,auVar48,1);
        auVar241._8_4_ = 0xff800000;
        auVar241._0_8_ = 0xff800000ff800000;
        auVar241._12_4_ = 0xff800000;
        auVar241._16_4_ = 0xff800000;
        auVar241._20_4_ = 0xff800000;
        auVar241._24_4_ = 0xff800000;
        auVar241._28_4_ = 0xff800000;
        auVar240 = vblendvps_avx(auVar241,auVar42,auVar89);
        auVar13 = auVar89 & auVar11;
        if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0x7f,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0xbf,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar13[0x1f] < '\0') {
          auVar235 = vandps_avx(auVar89,auVar11);
          auVar11 = vcmpps_avx(auVar85,ZEXT832(0) << 0x20,2);
          auVar237._8_4_ = 0xff800000;
          auVar237._0_8_ = 0xff800000ff800000;
          auVar237._12_4_ = 0xff800000;
          auVar237._16_4_ = 0xff800000;
          auVar237._20_4_ = 0xff800000;
          auVar237._24_4_ = 0xff800000;
          auVar237._28_4_ = 0xff800000;
          auVar125._8_4_ = 0x7f800000;
          auVar125._0_8_ = 0x7f8000007f800000;
          auVar125._12_4_ = 0x7f800000;
          auVar125._16_4_ = 0x7f800000;
          auVar125._20_4_ = 0x7f800000;
          auVar125._24_4_ = 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar85 = vblendvps_avx(auVar125,auVar237,auVar11);
          auVar8 = vpackssdw_avx(auVar235._0_16_,auVar235._16_16_);
          auVar13 = vpmovsxwd_avx2(auVar8);
          auVar221 = vblendvps_avx(auVar221,auVar85,auVar13);
          auVar85 = vblendvps_avx(auVar237,auVar125,auVar11);
          auVar240 = vblendvps_avx(auVar240,auVar85,auVar13);
          auVar146._0_8_ = auVar235._0_8_ ^ 0xffffffffffffffff;
          auVar146._8_4_ = auVar235._8_4_ ^ 0xffffffff;
          auVar146._12_4_ = auVar235._12_4_ ^ 0xffffffff;
          auVar146._16_4_ = auVar235._16_4_ ^ 0xffffffff;
          auVar146._20_4_ = auVar235._20_4_ ^ 0xffffffff;
          auVar146._24_4_ = auVar235._24_4_ ^ 0xffffffff;
          auVar146._28_4_ = auVar235._28_4_ ^ 0xffffffff;
          auVar235 = vorps_avx(auVar11,auVar146);
          auVar235 = vandps_avx(auVar89,auVar235);
        }
      }
      local_5c0 = auVar12;
      local_5a0 = vminps_avx(local_440,auVar221);
      _local_920 = vmaxps_avx(auVar12,auVar240);
      _local_460 = _local_920;
      auVar85 = vcmpps_avx(auVar12,local_5a0,2);
      local_760 = vandps_avx(auVar84,auVar85);
      auVar85 = vcmpps_avx(_local_920,local_440,2);
      auVar84 = vandps_avx(auVar84,auVar85);
      auVar242 = ZEXT3264(auVar84);
      auVar85 = vorps_avx(auVar84,local_760);
      if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar85 >> 0x7f,0) == '\0') &&
            (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar85 >> 0xbf,0) == '\0') &&
          (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar85[0x1f])
      {
        auVar249 = ZEXT3264(CONCAT824(uStack_a08,
                                      CONCAT816(uStack_a10,CONCAT88(uStack_a18,local_a20))));
        goto LAB_0119b672;
      }
      auVar49._4_4_ = (float)local_8c0._4_4_ * auVar191._4_4_;
      auVar49._0_4_ = (float)local_8c0._0_4_ * auVar191._0_4_;
      auVar49._8_4_ = fStack_8b8 * auVar191._8_4_;
      auVar49._12_4_ = fStack_8b4 * auVar191._12_4_;
      auVar49._16_4_ = fStack_8b0 * auVar191._16_4_;
      auVar49._20_4_ = fStack_8ac * auVar191._20_4_;
      auVar49._24_4_ = fStack_8a8 * auVar191._24_4_;
      auVar49._28_4_ = auVar85._28_4_;
      auVar8 = vfmadd213ps_fma(auVar204,_local_8a0,auVar49);
      auVar8 = vfmadd213ps_fma(auVar167,_local_7e0,ZEXT1632(auVar8));
      auVar92._0_8_ = auVar235._0_8_ ^ 0xffffffffffffffff;
      auVar92._8_4_ = auVar235._8_4_ ^ 0xffffffff;
      auVar92._12_4_ = auVar235._12_4_ ^ 0xffffffff;
      auVar92._16_4_ = auVar235._16_4_ ^ 0xffffffff;
      auVar92._20_4_ = auVar235._20_4_ ^ 0xffffffff;
      auVar92._24_4_ = auVar235._24_4_ ^ 0xffffffff;
      auVar92._28_4_ = auVar235._28_4_ ^ 0xffffffff;
      auVar235 = vandps_avx(ZEXT1632(auVar8),local_8e0);
      auVar143._8_4_ = 0x3e99999a;
      auVar143._0_8_ = 0x3e99999a3e99999a;
      auVar143._12_4_ = 0x3e99999a;
      auVar143._16_4_ = 0x3e99999a;
      auVar143._20_4_ = 0x3e99999a;
      auVar143._24_4_ = 0x3e99999a;
      auVar143._28_4_ = 0x3e99999a;
      auVar235 = vcmpps_avx(auVar235,auVar143,1);
      local_7a0 = vorps_avx(auVar235,auVar92);
      auVar50._4_4_ = (float)local_8c0._4_4_ * (float)local_ce0._4_4_;
      auVar50._0_4_ = (float)local_8c0._0_4_ * (float)local_ce0._0_4_;
      auVar50._8_4_ = fStack_8b8 * fStack_cd8;
      auVar50._12_4_ = fStack_8b4 * fStack_cd4;
      auVar50._16_4_ = fStack_8b0 * fStack_cd0;
      auVar50._20_4_ = fStack_8ac * fStack_ccc;
      auVar50._24_4_ = fStack_8a8 * fStack_cc8;
      auVar50._28_4_ = local_7a0._28_4_;
      auVar8 = vfmadd213ps_fma(auVar166,_local_8a0,auVar50);
      auVar8 = vfmadd213ps_fma(auVar182,_local_7e0,ZEXT1632(auVar8));
      auVar235 = vandps_avx(ZEXT1632(auVar8),local_8e0);
      auVar235 = vcmpps_avx(auVar235,auVar143,1);
      auVar235 = vorps_avx(auVar235,auVar92);
      auVar117._8_4_ = 3;
      auVar117._0_8_ = 0x300000003;
      auVar117._12_4_ = 3;
      auVar117._16_4_ = 3;
      auVar117._20_4_ = 3;
      auVar117._24_4_ = 3;
      auVar117._28_4_ = 3;
      auVar144._8_4_ = 2;
      auVar144._0_8_ = 0x200000002;
      auVar144._12_4_ = 2;
      auVar144._16_4_ = 2;
      auVar144._20_4_ = 2;
      auVar144._24_4_ = 2;
      auVar144._28_4_ = 2;
      auVar235 = vblendvps_avx(auVar144,auVar117,auVar235);
      local_7c0._4_4_ = local_ce4;
      local_7c0._0_4_ = local_ce4;
      local_7c0._8_4_ = local_ce4;
      local_7c0._12_4_ = local_ce4;
      local_7c0._16_4_ = local_ce4;
      local_7c0._20_4_ = local_ce4;
      local_7c0._24_4_ = local_ce4;
      local_7c0._28_4_ = local_ce4;
      local_780 = vpcmpgtd_avx2(auVar235,local_7c0);
      local_5e0 = vpandn_avx2(local_780,local_760);
      local_900._4_4_ = auVar12._4_4_ + (float)local_940._4_4_;
      local_900._0_4_ = auVar12._0_4_ + (float)local_940._0_4_;
      fStack_8f8 = auVar12._8_4_ + fStack_938;
      fStack_8f4 = auVar12._12_4_ + fStack_934;
      fStack_8f0 = auVar12._16_4_ + fStack_930;
      fStack_8ec = auVar12._20_4_ + fStack_92c;
      fStack_8e8 = auVar12._24_4_ + fStack_928;
      fStack_8e4 = auVar12._28_4_ + fStack_924;
      while( true ) {
        auVar235 = _local_460;
        fStack_bbc = auVar7._4_4_;
        fStack_bb8 = auVar7._8_4_;
        fStack_bb4 = auVar7._12_4_;
        if ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_5e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_5e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_5e0 >> 0x7f,0) == '\0') &&
              (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_5e0 >> 0xbf,0) == '\0') &&
            (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_5e0[0x1f]) break;
        auVar118._8_4_ = 0x7f800000;
        auVar118._0_8_ = 0x7f8000007f800000;
        auVar118._12_4_ = 0x7f800000;
        auVar118._16_4_ = 0x7f800000;
        auVar118._20_4_ = 0x7f800000;
        auVar118._24_4_ = 0x7f800000;
        auVar118._28_4_ = 0x7f800000;
        auVar235 = vblendvps_avx(auVar118,auVar12,local_5e0);
        auVar85 = vshufps_avx(auVar235,auVar235,0xb1);
        auVar85 = vminps_avx(auVar235,auVar85);
        auVar11 = vshufpd_avx(auVar85,auVar85,5);
        auVar85 = vminps_avx(auVar85,auVar11);
        auVar11 = vpermpd_avx2(auVar85,0x4e);
        auVar85 = vminps_avx(auVar85,auVar11);
        auVar85 = vcmpps_avx(auVar235,auVar85,0);
        auVar11 = local_5e0 & auVar85;
        auVar235 = local_5e0;
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0x7f,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0xbf,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar11[0x1f] < '\0') {
          auVar235 = vandps_avx(auVar85,local_5e0);
        }
        uVar59 = vmovmskps_avx(auVar235);
        iVar58 = 0;
        for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
          iVar58 = iVar58 + 1;
        }
        uVar65 = (ulong)(uint)(iVar58 << 2);
        *(undefined4 *)(local_5e0 + uVar65) = 0;
        uVar59 = *(uint *)(local_1a0 + uVar65);
        uVar63 = *(uint *)(local_5c0 + uVar65);
        fVar98 = auVar4._0_4_;
        if ((float)local_a40._0_4_ < 0.0) {
          auVar242 = ZEXT1664(auVar242._0_16_);
          fVar98 = sqrtf((float)local_a40._0_4_);
          uVar65 = extraout_RAX;
        }
        auVar132 = vminps_avx(auVar9,auVar73);
        auVar8 = vmaxps_avx(auVar9,auVar73);
        auVar100 = vminps_avx(auVar74,auVar7);
        auVar72 = vminps_avx(auVar132,auVar100);
        auVar132 = vmaxps_avx(auVar74,auVar7);
        auVar100 = vmaxps_avx(auVar8,auVar132);
        auVar8 = vandps_avx(auVar72,auVar225);
        auVar132 = vandps_avx(auVar100,auVar225);
        auVar8 = vmaxps_avx(auVar8,auVar132);
        auVar132 = vmovshdup_avx(auVar8);
        auVar132 = vmaxss_avx(auVar132,auVar8);
        auVar8 = vshufpd_avx(auVar8,auVar8,1);
        auVar8 = vmaxss_avx(auVar8,auVar132);
        local_a00._0_4_ = auVar8._0_4_ * 1.9073486e-06;
        local_a60._0_4_ = fVar98 * 1.9073486e-06;
        local_880._0_16_ = vshufps_avx(auVar100,auVar100,0xff);
        auVar8 = vinsertps_avx(ZEXT416(uVar63),ZEXT416(uVar59),0x10);
        for (uVar67 = 0; bVar57 = (byte)uVar65, uVar67 != 5; uVar67 = uVar67 + 1) {
          auVar100 = vmovshdup_avx(auVar8);
          fVar131 = 1.0 - auVar100._0_4_;
          auVar132 = vshufps_avx(auVar8,auVar8,0x55);
          fVar98 = auVar132._0_4_;
          auVar101._0_4_ = fVar95 * fVar98;
          fVar126 = auVar132._4_4_;
          auVar101._4_4_ = auVar73._4_4_ * fVar126;
          fVar127 = auVar132._8_4_;
          auVar101._8_4_ = auVar73._8_4_ * fVar127;
          fVar128 = auVar132._12_4_;
          auVar101._12_4_ = auVar73._12_4_ * fVar128;
          auVar134._4_4_ = fVar131;
          auVar134._0_4_ = fVar131;
          auVar134._8_4_ = fVar131;
          auVar134._12_4_ = fVar131;
          auVar132 = vfmadd231ps_fma(auVar101,auVar134,auVar9);
          auVar151._0_4_ = fVar97 * fVar98;
          auVar151._4_4_ = auVar74._4_4_ * fVar126;
          auVar151._8_4_ = auVar74._8_4_ * fVar127;
          auVar151._12_4_ = auVar74._12_4_ * fVar128;
          auVar72 = vfmadd231ps_fma(auVar151,auVar134,auVar73);
          auVar187._0_4_ = fVar98 * auVar72._0_4_;
          auVar187._4_4_ = fVar126 * auVar72._4_4_;
          auVar187._8_4_ = fVar127 * auVar72._8_4_;
          auVar187._12_4_ = fVar128 * auVar72._12_4_;
          auVar133 = vfmadd231ps_fma(auVar187,auVar134,auVar132);
          auVar102._0_4_ = fVar98 * fVar96;
          auVar102._4_4_ = fVar126 * fStack_bbc;
          auVar102._8_4_ = fVar127 * fStack_bb8;
          auVar102._12_4_ = fVar128 * fStack_bb4;
          auVar132 = vfmadd231ps_fma(auVar102,auVar134,auVar74);
          auVar174._0_4_ = fVar98 * auVar132._0_4_;
          auVar174._4_4_ = fVar126 * auVar132._4_4_;
          auVar174._8_4_ = fVar127 * auVar132._8_4_;
          auVar174._12_4_ = fVar128 * auVar132._12_4_;
          auVar150 = vfmadd231ps_fma(auVar174,auVar134,auVar72);
          fVar129 = auVar8._0_4_;
          auVar103._4_4_ = fVar129;
          auVar103._0_4_ = fVar129;
          auVar103._8_4_ = fVar129;
          auVar103._12_4_ = fVar129;
          auVar132 = vfmadd213ps_fma(auVar103,local_a30,_DAT_01f45a50);
          auVar76._0_4_ = fVar98 * auVar150._0_4_;
          auVar76._4_4_ = fVar126 * auVar150._4_4_;
          auVar76._8_4_ = fVar127 * auVar150._8_4_;
          auVar76._12_4_ = fVar128 * auVar150._12_4_;
          auVar72 = vfmadd231ps_fma(auVar76,auVar133,auVar134);
          local_9c0._0_16_ = auVar72;
          auVar72 = vsubps_avx(auVar132,auVar72);
          auVar132 = vdpps_avx(auVar72,auVar72,0x7f);
          fVar98 = auVar132._0_4_;
          if (fVar98 < 0.0) {
            local_aa0._0_16_ = auVar133;
            auVar259._0_4_ = sqrtf(fVar98);
            auVar259._4_60_ = extraout_var;
            auVar77 = auVar259._0_16_;
            uVar65 = extraout_RAX_00;
            auVar133 = local_aa0._0_16_;
          }
          else {
            auVar77 = vsqrtss_avx(auVar132,auVar132);
          }
          auVar133 = vsubps_avx(auVar150,auVar133);
          auVar213._0_4_ = auVar133._0_4_ * 3.0;
          auVar213._4_4_ = auVar133._4_4_ * 3.0;
          auVar213._8_4_ = auVar133._8_4_ * 3.0;
          auVar213._12_4_ = auVar133._12_4_ * 3.0;
          auVar133 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar131),auVar100)
          ;
          auVar150 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar100,ZEXT416((uint)fVar131))
          ;
          fVar131 = fVar131 * 6.0;
          fVar126 = auVar133._0_4_ * 6.0;
          fVar127 = auVar150._0_4_ * 6.0;
          fVar128 = auVar100._0_4_ * 6.0;
          auVar152._0_4_ = fVar128 * fVar96;
          auVar152._4_4_ = fVar128 * fStack_bbc;
          auVar152._8_4_ = fVar128 * fStack_bb8;
          auVar152._12_4_ = fVar128 * fStack_bb4;
          auVar104._4_4_ = fVar127;
          auVar104._0_4_ = fVar127;
          auVar104._8_4_ = fVar127;
          auVar104._12_4_ = fVar127;
          auVar100 = vfmadd132ps_fma(auVar104,auVar152,auVar74);
          auVar153._4_4_ = fVar126;
          auVar153._0_4_ = fVar126;
          auVar153._8_4_ = fVar126;
          auVar153._12_4_ = fVar126;
          auVar100 = vfmadd132ps_fma(auVar153,auVar100,auVar73);
          auVar133 = vdpps_avx(auVar213,auVar213,0x7f);
          auVar105._4_4_ = fVar131;
          auVar105._0_4_ = fVar131;
          auVar105._8_4_ = fVar131;
          auVar105._12_4_ = fVar131;
          auVar71 = vfmadd132ps_fma(auVar105,auVar100,auVar9);
          auVar100 = vblendps_avx(auVar133,_DAT_01f45a50,0xe);
          auVar150 = vrsqrtss_avx(auVar100,auVar100);
          fVar128 = auVar133._0_4_;
          fVar126 = auVar150._0_4_;
          auVar150 = vdpps_avx(auVar213,auVar71,0x7f);
          fVar126 = fVar126 * 1.5 + fVar128 * -0.5 * fVar126 * fVar126 * fVar126;
          auVar106._0_4_ = auVar71._0_4_ * fVar128;
          auVar106._4_4_ = auVar71._4_4_ * fVar128;
          auVar106._8_4_ = auVar71._8_4_ * fVar128;
          auVar106._12_4_ = auVar71._12_4_ * fVar128;
          fVar127 = auVar150._0_4_;
          auVar188._0_4_ = auVar213._0_4_ * fVar127;
          auVar188._4_4_ = auVar213._4_4_ * fVar127;
          auVar188._8_4_ = auVar213._8_4_ * fVar127;
          auVar188._12_4_ = auVar213._12_4_ * fVar127;
          auVar150 = vsubps_avx(auVar106,auVar188);
          auVar100 = vrcpss_avx(auVar100,auVar100);
          auVar71 = vfnmadd213ss_fma(auVar100,auVar133,ZEXT416(0x40000000));
          fVar127 = auVar100._0_4_ * auVar71._0_4_;
          auVar100 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                ZEXT416((uint)(fVar129 * (float)local_a60._0_4_)));
          auVar224 = ZEXT1664(auVar100);
          uVar51 = CONCAT44(auVar213._4_4_,auVar213._0_4_);
          auVar200._0_8_ = uVar51 ^ 0x8000000080000000;
          auVar200._8_4_ = -auVar213._8_4_;
          auVar200._12_4_ = -auVar213._12_4_;
          auVar154._0_4_ = fVar126 * auVar150._0_4_ * fVar127;
          auVar154._4_4_ = fVar126 * auVar150._4_4_ * fVar127;
          auVar154._8_4_ = fVar126 * auVar150._8_4_ * fVar127;
          auVar154._12_4_ = fVar126 * auVar150._12_4_ * fVar127;
          auVar247._0_4_ = auVar213._0_4_ * fVar126;
          auVar247._4_4_ = auVar213._4_4_ * fVar126;
          auVar247._8_4_ = auVar213._8_4_ * fVar126;
          auVar247._12_4_ = auVar213._12_4_ * fVar126;
          if (fVar128 < -fVar128) {
            local_aa0._0_4_ = auVar77._0_4_;
            local_ac0._0_16_ = auVar247;
            local_ae0._0_16_ = auVar154;
            fVar126 = sqrtf(fVar128);
            auVar77 = ZEXT416((uint)local_aa0._0_4_);
            auVar224 = ZEXT464(auVar100._0_4_);
            uVar65 = extraout_RAX_01;
            auVar154 = local_ae0._0_16_;
            auVar247 = local_ac0._0_16_;
          }
          else {
            auVar133 = vsqrtss_avx(auVar133,auVar133);
            fVar126 = auVar133._0_4_;
          }
          auVar133 = vdpps_avx(auVar72,auVar247,0x7f);
          auVar173 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar77,auVar224._0_16_);
          auVar150 = vdpps_avx(auVar200,auVar247,0x7f);
          auVar71 = vdpps_avx(auVar72,auVar154,0x7f);
          auVar99 = vdpps_avx(local_a30,auVar247,0x7f);
          auVar173 = vfmadd213ss_fma(ZEXT416((uint)(auVar77._0_4_ + 1.0)),
                                     ZEXT416((uint)((float)local_a00._0_4_ / fVar126)),auVar173);
          fVar126 = auVar150._0_4_ + auVar71._0_4_;
          auVar78._0_4_ = auVar133._0_4_ * auVar133._0_4_;
          auVar78._4_4_ = auVar133._4_4_ * auVar133._4_4_;
          auVar78._8_4_ = auVar133._8_4_ * auVar133._8_4_;
          auVar78._12_4_ = auVar133._12_4_ * auVar133._12_4_;
          auVar150 = vdpps_avx(auVar72,auVar200,0x7f);
          auVar71 = vsubps_avx(auVar132,auVar78);
          auVar77 = vrsqrtss_avx(auVar71,auVar71);
          fVar128 = auVar71._0_4_;
          fVar127 = auVar77._0_4_;
          fVar127 = fVar127 * 1.5 + fVar128 * -0.5 * fVar127 * fVar127 * fVar127;
          auVar77 = vdpps_avx(auVar72,local_a30,0x7f);
          auVar150 = vfnmadd231ss_fma(auVar150,auVar133,ZEXT416((uint)fVar126));
          auVar77 = vfnmadd231ss_fma(auVar77,auVar133,auVar99);
          if (fVar128 < 0.0) {
            local_aa0._0_16_ = auVar133;
            local_ac0._0_16_ = ZEXT416((uint)fVar126);
            local_ae0._0_16_ = auVar99;
            local_820._0_16_ = auVar150;
            local_840._0_4_ = fVar127;
            local_860._0_16_ = auVar77;
            fVar128 = sqrtf(fVar128);
            auVar224 = ZEXT464(auVar100._0_4_);
            uVar65 = extraout_RAX_02;
            fVar127 = (float)local_840._0_4_;
            auVar77 = local_860._0_16_;
            auVar150 = local_820._0_16_;
            auVar133 = local_aa0._0_16_;
            auVar99 = local_ae0._0_16_;
            auVar100 = local_ac0._0_16_;
          }
          else {
            auVar100 = vsqrtss_avx(auVar71,auVar71);
            fVar128 = auVar100._0_4_;
            auVar100 = ZEXT416((uint)fVar126);
          }
          auVar242 = ZEXT1664(auVar133);
          auVar71 = vpermilps_avx(local_9c0._0_16_,0xff);
          fVar128 = fVar128 - auVar71._0_4_;
          auVar71 = vshufps_avx(auVar213,auVar213,0xff);
          auVar150 = vfmsub213ss_fma(auVar150,ZEXT416((uint)fVar127),auVar71);
          auVar155._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
          auVar155._8_4_ = auVar99._8_4_ ^ 0x80000000;
          auVar155._12_4_ = auVar99._12_4_ ^ 0x80000000;
          auVar175._0_8_ = auVar150._0_8_ ^ 0x8000000080000000;
          auVar175._8_4_ = auVar150._8_4_ ^ 0x80000000;
          auVar175._12_4_ = auVar150._12_4_ ^ 0x80000000;
          auVar135 = ZEXT416((uint)(auVar77._0_4_ * fVar127));
          auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar99._0_4_ * auVar150._0_4_)),auVar100,
                                    auVar135);
          auVar150 = vinsertps_avx(auVar175,auVar135,0x1c);
          uVar66 = auVar77._0_4_;
          auVar176._4_4_ = uVar66;
          auVar176._0_4_ = uVar66;
          auVar176._8_4_ = uVar66;
          auVar176._12_4_ = uVar66;
          auVar150 = vdivps_avx(auVar150,auVar176);
          auVar100 = vinsertps_avx(auVar100,auVar155,0x10);
          auVar100 = vdivps_avx(auVar100,auVar176);
          fVar126 = auVar133._0_4_;
          auVar136._0_4_ = fVar126 * auVar150._0_4_ + fVar128 * auVar100._0_4_;
          auVar136._4_4_ = fVar126 * auVar150._4_4_ + fVar128 * auVar100._4_4_;
          auVar136._8_4_ = fVar126 * auVar150._8_4_ + fVar128 * auVar100._8_4_;
          auVar136._12_4_ = fVar126 * auVar150._12_4_ + fVar128 * auVar100._12_4_;
          auVar8 = vsubps_avx(auVar8,auVar136);
          auVar100 = vandps_avx(auVar133,auVar225);
          if (auVar100._0_4_ < auVar173._0_4_) {
            auVar150 = vfmadd231ss_fma(ZEXT416((uint)(auVar224._0_4_ + auVar173._0_4_)),
                                       local_880._0_16_,ZEXT416(0x36000000));
            auVar100 = vandps_avx(ZEXT416((uint)fVar128),auVar225);
            if (auVar100._0_4_ < auVar150._0_4_) {
              bVar68 = uVar67 < 5;
              fVar126 = auVar8._0_4_ + (float)local_970._0_4_;
              if (fVar126 < fVar69) {
LAB_0119bec7:
                bVar57 = 0;
                goto LAB_0119bedb;
              }
              fVar127 = *(float *)(ray + k * 4 + 0x100);
              if (fVar126 <= fVar127) {
                auVar8 = vmovshdup_avx(auVar8);
                bVar57 = 0;
                if ((auVar8._0_4_ < 0.0) || (1.0 < auVar8._0_4_)) goto LAB_0119bedb;
                auVar132 = vrsqrtss_avx(auVar132,auVar132);
                fVar128 = auVar132._0_4_;
                pGVar2 = (context->scene->geometries).items[uVar60].ptr;
                if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_0119bec7;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar57 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_0119bedb;
                fVar98 = fVar128 * 1.5 + fVar98 * -0.5 * fVar128 * fVar128 * fVar128;
                local_b80 = auVar72._0_4_;
                fStack_b7c = auVar72._4_4_;
                fStack_b78 = auVar72._8_4_;
                fStack_b74 = auVar72._12_4_;
                auVar156._0_4_ = fVar98 * local_b80;
                auVar156._4_4_ = fVar98 * fStack_b7c;
                auVar156._8_4_ = fVar98 * fStack_b78;
                auVar156._12_4_ = fVar98 * fStack_b74;
                auVar150 = vfmadd213ps_fma(auVar71,auVar156,auVar213);
                auVar132 = vshufps_avx(auVar156,auVar156,0xc9);
                auVar100 = vshufps_avx(auVar213,auVar213,0xc9);
                auVar157._0_4_ = auVar156._0_4_ * auVar100._0_4_;
                auVar157._4_4_ = auVar156._4_4_ * auVar100._4_4_;
                auVar157._8_4_ = auVar156._8_4_ * auVar100._8_4_;
                auVar157._12_4_ = auVar156._12_4_ * auVar100._12_4_;
                auVar72 = vfmsub231ps_fma(auVar157,auVar213,auVar132);
                auVar132 = vshufps_avx(auVar72,auVar72,0xc9);
                auVar100 = vshufps_avx(auVar150,auVar150,0xc9);
                auVar72 = vshufps_avx(auVar72,auVar72,0xd2);
                auVar79._0_4_ = auVar150._0_4_ * auVar72._0_4_;
                auVar79._4_4_ = auVar150._4_4_ * auVar72._4_4_;
                auVar79._8_4_ = auVar150._8_4_ * auVar72._8_4_;
                auVar79._12_4_ = auVar150._12_4_ * auVar72._12_4_;
                auVar132 = vfmsub231ps_fma(auVar79,auVar132,auVar100);
                local_520 = auVar8._0_8_;
                auVar8 = vmovshdup_avx(auVar132);
                local_580._8_8_ = auVar8._0_8_;
                auVar8 = vshufps_avx(auVar132,auVar132,0xaa);
                local_560 = auVar8._0_8_;
                local_540 = auVar132._0_4_;
                local_580._0_8_ = local_580._8_8_;
                local_580._16_8_ = local_580._8_8_;
                local_580._24_8_ = local_580._8_8_;
                uStack_558 = local_560;
                uStack_550 = local_560;
                uStack_548 = local_560;
                uStack_53c = local_540;
                uStack_538 = local_540;
                uStack_534 = local_540;
                uStack_530 = local_540;
                uStack_52c = local_540;
                uStack_528 = local_540;
                uStack_524 = local_540;
                uStack_518 = local_520;
                uStack_510 = local_520;
                uStack_508 = local_520;
                auVar137._12_4_ = 0;
                auVar137._0_12_ = ZEXT812(0);
                auVar137 = auVar137 << 0x20;
                local_500 = ZEXT1232(ZEXT812(0)) << 0x20;
                local_4e0 = CONCAT44(uStack_6fc,local_700);
                uStack_4d8 = CONCAT44(uStack_6f4,uStack_6f8);
                uStack_4d0 = CONCAT44(uStack_6ec,uStack_6f0);
                uStack_4c8 = CONCAT44(uStack_6e4,uStack_6e8);
                local_4c0._4_4_ = uStack_6dc;
                local_4c0._0_4_ = local_6e0;
                local_4c0._8_4_ = uStack_6d8;
                local_4c0._12_4_ = uStack_6d4;
                local_4c0._16_4_ = uStack_6d0;
                local_4c0._20_4_ = uStack_6cc;
                local_4c0._24_4_ = uStack_6c8;
                local_4c0._28_4_ = uStack_6c4;
                vpcmpeqd_avx2(local_4c0,local_4c0);
                local_4a0 = context->user->instID[0];
                uStack_49c = local_4a0;
                uStack_498 = local_4a0;
                uStack_494 = local_4a0;
                uStack_490 = local_4a0;
                uStack_48c = local_4a0;
                uStack_488 = local_4a0;
                uStack_484 = local_4a0;
                local_480 = context->user->instPrimID[0];
                uStack_47c = local_480;
                uStack_478 = local_480;
                uStack_474 = local_480;
                uStack_470 = local_480;
                uStack_46c = local_480;
                uStack_468 = local_480;
                uStack_464 = local_480;
                *(float *)(ray + k * 4 + 0x100) = fVar126;
                local_9a0 = local_720;
                local_b10.valid = (int *)local_9a0;
                local_b10.geometryUserPtr = pGVar2->userPtr;
                local_b10.context = context->user;
                local_b10.hit = (RTCHitN *)local_580;
                local_b10.N = 8;
                local_b10.ray = (RTCRayN *)ray;
                if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar242 = ZEXT1664(auVar133);
                  (*pGVar2->occlusionFilterN)(&local_b10);
                  auVar137 = ZEXT816(0) << 0x40;
                }
                auVar85 = ZEXT1632(auVar137);
                auVar235 = vpcmpeqd_avx2(local_9a0,auVar85);
                auVar235 = _DAT_01f7b020 & ~auVar235;
                if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar235 >> 0x7f,0) != '\0') ||
                      (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar235 >> 0xbf,0) != '\0') ||
                    (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar235[0x1f] < '\0') {
                  p_Var3 = context->args->filter;
                  if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar242 = ZEXT1664(auVar242._0_16_);
                    (*p_Var3)(&local_b10);
                    auVar85 = ZEXT832(0) << 0x40;
                  }
                  auVar85 = vpcmpeqd_avx2(local_9a0,auVar85);
                  auVar119._8_4_ = 0xff800000;
                  auVar119._0_8_ = 0xff800000ff800000;
                  auVar119._12_4_ = 0xff800000;
                  auVar119._16_4_ = 0xff800000;
                  auVar119._20_4_ = 0xff800000;
                  auVar119._24_4_ = 0xff800000;
                  auVar119._28_4_ = 0xff800000;
                  auVar235 = vblendvps_avx(auVar119,*(undefined1 (*) [32])(local_b10.ray + 0x100),
                                           auVar85);
                  *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar235;
                  auVar235 = _DAT_01f7b020 & ~auVar85;
                  if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar235 >> 0x7f,0) != '\0') ||
                        (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar235 >> 0xbf,0) != '\0') ||
                      (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar235[0x1f] < '\0') {
                    bVar57 = 1;
                    goto LAB_0119bedb;
                  }
                }
                *(float *)(ray + k * 4 + 0x100) = fVar127;
              }
              bVar57 = 0;
              goto LAB_0119bedb;
            }
          }
        }
        bVar68 = false;
LAB_0119bedb:
        uVar66 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar230._4_4_ = uVar66;
        auVar230._0_4_ = uVar66;
        auVar230._8_4_ = uVar66;
        auVar230._12_4_ = uVar66;
        auVar230._16_4_ = uVar66;
        auVar230._20_4_ = uVar66;
        auVar230._24_4_ = uVar66;
        auVar230._28_4_ = uVar66;
        auVar232 = ZEXT3264(auVar230);
        bVar64 = bVar64 | bVar68 & bVar57;
        auVar235 = vcmpps_avx(_local_900,auVar230,2);
        local_5e0 = vandps_avx(auVar235,local_5e0);
      }
      auVar93._0_4_ = (float)local_940._0_4_ + (float)local_920._0_4_;
      auVar93._4_4_ = (float)local_940._4_4_ + (float)local_920._4_4_;
      auVar93._8_4_ = fStack_938 + fStack_918;
      auVar93._12_4_ = fStack_934 + fStack_914;
      auVar93._16_4_ = fStack_930 + fStack_910;
      auVar93._20_4_ = fStack_92c + fStack_90c;
      auVar93._24_4_ = fStack_928 + fStack_908;
      auVar93._28_4_ = fStack_924 + fStack_904;
      uVar66 = auVar232._0_4_;
      auVar120._4_4_ = uVar66;
      auVar120._0_4_ = uVar66;
      auVar120._8_4_ = uVar66;
      auVar120._12_4_ = uVar66;
      auVar120._16_4_ = uVar66;
      auVar120._20_4_ = uVar66;
      auVar120._24_4_ = uVar66;
      auVar120._28_4_ = uVar66;
      auVar85 = vcmpps_avx(auVar93,auVar120,2);
      _local_900 = vandps_avx(auVar85,auVar84);
      auVar94._8_4_ = 3;
      auVar94._0_8_ = 0x300000003;
      auVar94._12_4_ = 3;
      auVar94._16_4_ = 3;
      auVar94._20_4_ = 3;
      auVar94._24_4_ = 3;
      auVar94._28_4_ = 3;
      auVar121._8_4_ = 2;
      auVar121._0_8_ = 0x200000002;
      auVar121._12_4_ = 2;
      auVar121._16_4_ = 2;
      auVar121._20_4_ = 2;
      auVar121._24_4_ = 2;
      auVar121._28_4_ = 2;
      auVar84 = vblendvps_avx(auVar121,auVar94,local_7a0);
      _local_920 = vpcmpgtd_avx2(auVar84,local_7c0);
      local_600 = vpandn_avx2(_local_920,_local_900);
      local_b60._4_4_ = (float)local_940._4_4_ + (float)local_460._4_4_;
      local_b60._0_4_ = (float)local_940._0_4_ + (float)local_460._0_4_;
      fStack_b58 = fStack_938 + fStack_458;
      fStack_b54 = fStack_934 + fStack_454;
      fStack_b50 = fStack_930 + fStack_450;
      fStack_b4c = fStack_92c + fStack_44c;
      fStack_b48 = fStack_928 + fStack_448;
      fStack_b44 = fStack_924 + fStack_444;
      auVar270 = ZEXT3264(local_a80);
      for (; (((((((local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(local_600 >> 0x7f,0) != '\0') ||
               (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(local_600 >> 0xbf,0) != '\0') ||
             (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             local_600[0x1f] < '\0'; local_600 = vandps_avx(auVar84,local_600)) {
        auVar122._8_4_ = 0x7f800000;
        auVar122._0_8_ = 0x7f8000007f800000;
        auVar122._12_4_ = 0x7f800000;
        auVar122._16_4_ = 0x7f800000;
        auVar122._20_4_ = 0x7f800000;
        auVar122._24_4_ = 0x7f800000;
        auVar122._28_4_ = 0x7f800000;
        auVar84 = vblendvps_avx(auVar122,auVar235,local_600);
        auVar85 = vshufps_avx(auVar84,auVar84,0xb1);
        auVar85 = vminps_avx(auVar84,auVar85);
        auVar11 = vshufpd_avx(auVar85,auVar85,5);
        auVar85 = vminps_avx(auVar85,auVar11);
        auVar11 = vpermpd_avx2(auVar85,0x4e);
        auVar85 = vminps_avx(auVar85,auVar11);
        auVar85 = vcmpps_avx(auVar84,auVar85,0);
        auVar11 = local_600 & auVar85;
        auVar84 = local_600;
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0x7f,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0xbf,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar11[0x1f] < '\0') {
          auVar84 = vandps_avx(auVar85,local_600);
        }
        uVar59 = vmovmskps_avx(auVar84);
        iVar58 = 0;
        for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
          iVar58 = iVar58 + 1;
        }
        uVar65 = (ulong)(uint)(iVar58 << 2);
        *(undefined4 *)(local_600 + uVar65) = 0;
        uVar59 = *(uint *)(local_1c0 + uVar65);
        uVar63 = *(uint *)(local_440 + uVar65);
        fVar98 = auVar6._0_4_;
        if ((float)local_a40._0_4_ < 0.0) {
          auVar242 = ZEXT1664(auVar242._0_16_);
          fVar98 = sqrtf((float)local_a40._0_4_);
          auVar270 = ZEXT3264(local_a80);
          uVar65 = extraout_RAX_03;
        }
        auVar132 = vminps_avx(auVar9,auVar73);
        auVar8 = vmaxps_avx(auVar9,auVar73);
        auVar100 = vminps_avx(auVar74,auVar7);
        auVar72 = vminps_avx(auVar132,auVar100);
        auVar132 = vmaxps_avx(auVar74,auVar7);
        auVar100 = vmaxps_avx(auVar8,auVar132);
        auVar8 = vandps_avx(auVar72,auVar225);
        auVar132 = vandps_avx(auVar100,auVar225);
        auVar8 = vmaxps_avx(auVar8,auVar132);
        auVar132 = vmovshdup_avx(auVar8);
        auVar132 = vmaxss_avx(auVar132,auVar8);
        auVar8 = vshufpd_avx(auVar8,auVar8,1);
        auVar8 = vmaxss_avx(auVar8,auVar132);
        local_a00._0_4_ = auVar8._0_4_ * 1.9073486e-06;
        local_aa0._0_4_ = fVar98 * 1.9073486e-06;
        local_880._0_16_ = vshufps_avx(auVar100,auVar100,0xff);
        auVar8 = vinsertps_avx(ZEXT416(uVar63),ZEXT416(uVar59),0x10);
        for (uVar67 = 0; bVar57 = (byte)uVar65, uVar67 != 5; uVar67 = uVar67 + 1) {
          auVar100 = vmovshdup_avx(auVar8);
          fVar131 = 1.0 - auVar100._0_4_;
          auVar132 = vshufps_avx(auVar8,auVar8,0x55);
          fVar98 = auVar132._0_4_;
          auVar107._0_4_ = fVar95 * fVar98;
          fVar126 = auVar132._4_4_;
          auVar107._4_4_ = auVar73._4_4_ * fVar126;
          fVar127 = auVar132._8_4_;
          auVar107._8_4_ = auVar73._8_4_ * fVar127;
          fVar128 = auVar132._12_4_;
          auVar107._12_4_ = auVar73._12_4_ * fVar128;
          auVar138._4_4_ = fVar131;
          auVar138._0_4_ = fVar131;
          auVar138._8_4_ = fVar131;
          auVar138._12_4_ = fVar131;
          auVar132 = vfmadd231ps_fma(auVar107,auVar138,auVar9);
          auVar158._0_4_ = fVar97 * fVar98;
          auVar158._4_4_ = auVar74._4_4_ * fVar126;
          auVar158._8_4_ = auVar74._8_4_ * fVar127;
          auVar158._12_4_ = auVar74._12_4_ * fVar128;
          auVar72 = vfmadd231ps_fma(auVar158,auVar138,auVar73);
          auVar189._0_4_ = fVar98 * auVar72._0_4_;
          auVar189._4_4_ = fVar126 * auVar72._4_4_;
          auVar189._8_4_ = fVar127 * auVar72._8_4_;
          auVar189._12_4_ = fVar128 * auVar72._12_4_;
          auVar133 = vfmadd231ps_fma(auVar189,auVar138,auVar132);
          auVar108._0_4_ = fVar98 * fVar96;
          auVar108._4_4_ = fVar126 * fStack_bbc;
          auVar108._8_4_ = fVar127 * fStack_bb8;
          auVar108._12_4_ = fVar128 * fStack_bb4;
          auVar132 = vfmadd231ps_fma(auVar108,auVar138,auVar74);
          auVar177._0_4_ = fVar98 * auVar132._0_4_;
          auVar177._4_4_ = fVar126 * auVar132._4_4_;
          auVar177._8_4_ = fVar127 * auVar132._8_4_;
          auVar177._12_4_ = fVar128 * auVar132._12_4_;
          auVar150 = vfmadd231ps_fma(auVar177,auVar138,auVar72);
          fVar129 = auVar8._0_4_;
          auVar109._4_4_ = fVar129;
          auVar109._0_4_ = fVar129;
          auVar109._8_4_ = fVar129;
          auVar109._12_4_ = fVar129;
          auVar132 = vfmadd213ps_fma(auVar109,local_a30,_DAT_01f45a50);
          auVar80._0_4_ = fVar98 * auVar150._0_4_;
          auVar80._4_4_ = fVar126 * auVar150._4_4_;
          auVar80._8_4_ = fVar127 * auVar150._8_4_;
          auVar80._12_4_ = fVar128 * auVar150._12_4_;
          auVar72 = vfmadd231ps_fma(auVar80,auVar133,auVar138);
          local_9c0._0_16_ = auVar72;
          auVar72 = vsubps_avx(auVar132,auVar72);
          auVar132 = vdpps_avx(auVar72,auVar72,0x7f);
          fVar98 = auVar132._0_4_;
          if (fVar98 < 0.0) {
            local_a60._0_16_ = auVar133;
            auVar249._0_4_ = sqrtf(fVar98);
            auVar249._4_60_ = extraout_var_00;
            auVar77 = auVar249._0_16_;
            uVar65 = extraout_RAX_04;
            auVar133 = local_a60._0_16_;
          }
          else {
            auVar77 = vsqrtss_avx(auVar132,auVar132);
          }
          auVar133 = vsubps_avx(auVar150,auVar133);
          auVar214._0_4_ = auVar133._0_4_ * 3.0;
          auVar214._4_4_ = auVar133._4_4_ * 3.0;
          auVar214._8_4_ = auVar133._8_4_ * 3.0;
          auVar214._12_4_ = auVar133._12_4_ * 3.0;
          auVar133 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar131),auVar100)
          ;
          auVar150 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar100,ZEXT416((uint)fVar131))
          ;
          fVar131 = fVar131 * 6.0;
          fVar126 = auVar133._0_4_ * 6.0;
          fVar127 = auVar150._0_4_ * 6.0;
          fVar128 = auVar100._0_4_ * 6.0;
          auVar159._0_4_ = fVar128 * fVar96;
          auVar159._4_4_ = fVar128 * fStack_bbc;
          auVar159._8_4_ = fVar128 * fStack_bb8;
          auVar159._12_4_ = fVar128 * fStack_bb4;
          auVar110._4_4_ = fVar127;
          auVar110._0_4_ = fVar127;
          auVar110._8_4_ = fVar127;
          auVar110._12_4_ = fVar127;
          auVar100 = vfmadd132ps_fma(auVar110,auVar159,auVar74);
          auVar160._4_4_ = fVar126;
          auVar160._0_4_ = fVar126;
          auVar160._8_4_ = fVar126;
          auVar160._12_4_ = fVar126;
          auVar100 = vfmadd132ps_fma(auVar160,auVar100,auVar73);
          auVar133 = vdpps_avx(auVar214,auVar214,0x7f);
          auVar111._4_4_ = fVar131;
          auVar111._0_4_ = fVar131;
          auVar111._8_4_ = fVar131;
          auVar111._12_4_ = fVar131;
          auVar71 = vfmadd132ps_fma(auVar111,auVar100,auVar9);
          auVar100 = vblendps_avx(auVar133,_DAT_01f45a50,0xe);
          auVar150 = vrsqrtss_avx(auVar100,auVar100);
          fVar128 = auVar133._0_4_;
          fVar126 = auVar150._0_4_;
          auVar150 = vdpps_avx(auVar214,auVar71,0x7f);
          fVar126 = fVar126 * 1.5 + fVar128 * -0.5 * fVar126 * fVar126 * fVar126;
          auVar112._0_4_ = auVar71._0_4_ * fVar128;
          auVar112._4_4_ = auVar71._4_4_ * fVar128;
          auVar112._8_4_ = auVar71._8_4_ * fVar128;
          auVar112._12_4_ = auVar71._12_4_ * fVar128;
          fVar127 = auVar150._0_4_;
          auVar190._0_4_ = auVar214._0_4_ * fVar127;
          auVar190._4_4_ = auVar214._4_4_ * fVar127;
          auVar190._8_4_ = auVar214._8_4_ * fVar127;
          auVar190._12_4_ = auVar214._12_4_ * fVar127;
          auVar150 = vsubps_avx(auVar112,auVar190);
          auVar100 = vrcpss_avx(auVar100,auVar100);
          auVar71 = vfnmadd213ss_fma(auVar100,auVar133,ZEXT416(0x40000000));
          fVar127 = auVar100._0_4_ * auVar71._0_4_;
          auVar100 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                ZEXT416((uint)(fVar129 * (float)local_aa0._0_4_)));
          auVar242 = ZEXT1664(auVar100);
          uVar51 = CONCAT44(auVar214._4_4_,auVar214._0_4_);
          auVar234._0_8_ = uVar51 ^ 0x8000000080000000;
          auVar234._8_4_ = -auVar214._8_4_;
          auVar234._12_4_ = -auVar214._12_4_;
          auVar161._0_4_ = fVar126 * auVar150._0_4_ * fVar127;
          auVar161._4_4_ = fVar126 * auVar150._4_4_ * fVar127;
          auVar161._8_4_ = fVar126 * auVar150._8_4_ * fVar127;
          auVar161._12_4_ = fVar126 * auVar150._12_4_ * fVar127;
          auVar201._0_4_ = auVar214._0_4_ * fVar126;
          auVar201._4_4_ = auVar214._4_4_ * fVar126;
          auVar201._8_4_ = auVar214._8_4_ * fVar126;
          auVar201._12_4_ = auVar214._12_4_ * fVar126;
          if (fVar128 < -fVar128) {
            local_a60._0_4_ = auVar77._0_4_;
            local_ac0._0_16_ = auVar201;
            local_ae0._0_16_ = auVar161;
            fVar126 = sqrtf(fVar128);
            auVar77 = ZEXT416((uint)local_a60._0_4_);
            auVar242 = ZEXT464(auVar100._0_4_);
            uVar65 = extraout_RAX_05;
            auVar161 = local_ae0._0_16_;
            auVar201 = local_ac0._0_16_;
          }
          else {
            auVar133 = vsqrtss_avx(auVar133,auVar133);
            fVar126 = auVar133._0_4_;
          }
          auVar133 = vdpps_avx(auVar72,auVar201,0x7f);
          auVar173 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar77,auVar242._0_16_);
          auVar150 = vdpps_avx(auVar234,auVar201,0x7f);
          auVar71 = vdpps_avx(auVar72,auVar161,0x7f);
          auVar99 = vdpps_avx(local_a30,auVar201,0x7f);
          auVar184 = vfmadd213ss_fma(ZEXT416((uint)(auVar77._0_4_ + 1.0)),
                                     ZEXT416((uint)((float)local_a00._0_4_ / fVar126)),auVar173);
          fVar127 = auVar133._0_4_;
          auVar81._0_4_ = fVar127 * fVar127;
          auVar81._4_4_ = auVar133._4_4_ * auVar133._4_4_;
          auVar81._8_4_ = auVar133._8_4_ * auVar133._8_4_;
          auVar81._12_4_ = auVar133._12_4_ * auVar133._12_4_;
          auVar77 = vdpps_avx(auVar72,auVar234,0x7f);
          auVar135 = vsubps_avx(auVar132,auVar81);
          auVar173 = vrsqrtss_avx(auVar135,auVar135);
          fVar128 = auVar135._0_4_;
          fVar126 = auVar173._0_4_;
          fVar126 = fVar126 * 1.5 + fVar128 * -0.5 * fVar126 * fVar126 * fVar126;
          auVar173 = vdpps_avx(auVar72,local_a30,0x7f);
          local_a60._0_16_ = ZEXT416((uint)(auVar150._0_4_ + auVar71._0_4_));
          auVar150 = vfnmadd231ss_fma(auVar77,auVar133,local_a60._0_16_);
          auVar77 = vfnmadd231ss_fma(auVar173,auVar133,auVar99);
          if (fVar128 < 0.0) {
            local_ac0._0_4_ = auVar184._0_4_;
            local_ae0._0_16_ = auVar99;
            local_820._0_16_ = auVar150;
            local_840._0_4_ = fVar126;
            local_860._0_16_ = auVar77;
            fVar128 = sqrtf(fVar128);
            auVar242 = ZEXT464(auVar100._0_4_);
            uVar65 = extraout_RAX_06;
            fVar126 = (float)local_840._0_4_;
            auVar77 = local_860._0_16_;
            auVar99 = local_ae0._0_16_;
            auVar150 = local_820._0_16_;
            fVar131 = (float)local_ac0._0_4_;
          }
          else {
            auVar100 = vsqrtss_avx(auVar135,auVar135);
            fVar128 = auVar100._0_4_;
            fVar131 = auVar184._0_4_;
          }
          auVar270 = ZEXT3264(local_a80);
          auVar100 = vpermilps_avx(local_9c0._0_16_,0xff);
          fVar128 = fVar128 - auVar100._0_4_;
          auVar71 = vshufps_avx(auVar214,auVar214,0xff);
          auVar100 = vfmsub213ss_fma(auVar150,ZEXT416((uint)fVar126),auVar71);
          auVar162._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
          auVar162._8_4_ = auVar99._8_4_ ^ 0x80000000;
          auVar162._12_4_ = auVar99._12_4_ ^ 0x80000000;
          auVar178._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
          auVar178._8_4_ = auVar100._8_4_ ^ 0x80000000;
          auVar178._12_4_ = auVar100._12_4_ ^ 0x80000000;
          auVar77 = ZEXT416((uint)(auVar77._0_4_ * fVar126));
          auVar150 = vfmsub231ss_fma(ZEXT416((uint)(auVar100._0_4_ * auVar99._0_4_)),
                                     local_a60._0_16_,auVar77);
          auVar100 = vinsertps_avx(auVar178,auVar77,0x1c);
          uVar66 = auVar150._0_4_;
          auVar179._4_4_ = uVar66;
          auVar179._0_4_ = uVar66;
          auVar179._8_4_ = uVar66;
          auVar179._12_4_ = uVar66;
          auVar100 = vdivps_avx(auVar100,auVar179);
          auVar150 = vinsertps_avx(local_a60._0_16_,auVar162,0x10);
          auVar150 = vdivps_avx(auVar150,auVar179);
          auVar139._0_4_ = fVar127 * auVar100._0_4_ + fVar128 * auVar150._0_4_;
          auVar139._4_4_ = fVar127 * auVar100._4_4_ + fVar128 * auVar150._4_4_;
          auVar139._8_4_ = fVar127 * auVar100._8_4_ + fVar128 * auVar150._8_4_;
          auVar139._12_4_ = fVar127 * auVar100._12_4_ + fVar128 * auVar150._12_4_;
          auVar8 = vsubps_avx(auVar8,auVar139);
          auVar100 = vandps_avx(auVar133,auVar225);
          if (auVar100._0_4_ < fVar131) {
            auVar133 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ + fVar131)),local_880._0_16_,
                                       ZEXT416(0x36000000));
            auVar100 = vandps_avx(ZEXT416((uint)fVar128),auVar225);
            if (auVar100._0_4_ < auVar133._0_4_) {
              bVar68 = uVar67 < 5;
              fVar126 = auVar8._0_4_ + (float)local_970._0_4_;
              if (fVar69 <= fVar126) {
                fVar127 = *(float *)(ray + k * 4 + 0x100);
                auVar242 = ZEXT464((uint)fVar127);
                if (fVar126 <= fVar127) {
                  auVar8 = vmovshdup_avx(auVar8);
                  bVar57 = 0;
                  if ((auVar8._0_4_ < 0.0) || (1.0 < auVar8._0_4_)) goto LAB_0119c8e3;
                  auVar132 = vrsqrtss_avx(auVar132,auVar132);
                  fVar128 = auVar132._0_4_;
                  pGVar2 = (context->scene->geometries).items[uVar60].ptr;
                  if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar57 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_0119c8e3;
                    fVar98 = fVar128 * 1.5 + fVar98 * -0.5 * fVar128 * fVar128 * fVar128;
                    local_b80 = auVar72._0_4_;
                    fStack_b7c = auVar72._4_4_;
                    fStack_b78 = auVar72._8_4_;
                    fStack_b74 = auVar72._12_4_;
                    auVar163._0_4_ = fVar98 * local_b80;
                    auVar163._4_4_ = fVar98 * fStack_b7c;
                    auVar163._8_4_ = fVar98 * fStack_b78;
                    auVar163._12_4_ = fVar98 * fStack_b74;
                    auVar133 = vfmadd213ps_fma(auVar71,auVar163,auVar214);
                    auVar132 = vshufps_avx(auVar163,auVar163,0xc9);
                    auVar100 = vshufps_avx(auVar214,auVar214,0xc9);
                    auVar164._0_4_ = auVar163._0_4_ * auVar100._0_4_;
                    auVar164._4_4_ = auVar163._4_4_ * auVar100._4_4_;
                    auVar164._8_4_ = auVar163._8_4_ * auVar100._8_4_;
                    auVar164._12_4_ = auVar163._12_4_ * auVar100._12_4_;
                    auVar72 = vfmsub231ps_fma(auVar164,auVar214,auVar132);
                    auVar132 = vshufps_avx(auVar72,auVar72,0xc9);
                    auVar100 = vshufps_avx(auVar133,auVar133,0xc9);
                    auVar72 = vshufps_avx(auVar72,auVar72,0xd2);
                    auVar82._0_4_ = auVar133._0_4_ * auVar72._0_4_;
                    auVar82._4_4_ = auVar133._4_4_ * auVar72._4_4_;
                    auVar82._8_4_ = auVar133._8_4_ * auVar72._8_4_;
                    auVar82._12_4_ = auVar133._12_4_ * auVar72._12_4_;
                    auVar132 = vfmsub231ps_fma(auVar82,auVar132,auVar100);
                    local_520 = auVar8._0_8_;
                    auVar8 = vmovshdup_avx(auVar132);
                    local_580._8_8_ = auVar8._0_8_;
                    auVar8 = vshufps_avx(auVar132,auVar132,0xaa);
                    local_560 = auVar8._0_8_;
                    local_540 = auVar132._0_4_;
                    local_580._0_8_ = local_580._8_8_;
                    local_580._16_8_ = local_580._8_8_;
                    local_580._24_8_ = local_580._8_8_;
                    uStack_558 = local_560;
                    uStack_550 = local_560;
                    uStack_548 = local_560;
                    uStack_53c = local_540;
                    uStack_538 = local_540;
                    uStack_534 = local_540;
                    uStack_530 = local_540;
                    uStack_52c = local_540;
                    uStack_528 = local_540;
                    uStack_524 = local_540;
                    uStack_518 = local_520;
                    uStack_510 = local_520;
                    uStack_508 = local_520;
                    auVar140._12_4_ = 0;
                    auVar140._0_12_ = ZEXT812(0);
                    auVar140 = auVar140 << 0x20;
                    local_500 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_4e0 = CONCAT44(uStack_6fc,local_700);
                    uStack_4d8 = CONCAT44(uStack_6f4,uStack_6f8);
                    uStack_4d0 = CONCAT44(uStack_6ec,uStack_6f0);
                    uStack_4c8 = CONCAT44(uStack_6e4,uStack_6e8);
                    local_4c0._4_4_ = uStack_6dc;
                    local_4c0._0_4_ = local_6e0;
                    local_4c0._8_4_ = uStack_6d8;
                    local_4c0._12_4_ = uStack_6d4;
                    local_4c0._16_4_ = uStack_6d0;
                    local_4c0._20_4_ = uStack_6cc;
                    local_4c0._24_4_ = uStack_6c8;
                    local_4c0._28_4_ = uStack_6c4;
                    vpcmpeqd_avx2(local_4c0,local_4c0);
                    local_4a0 = context->user->instID[0];
                    uStack_49c = local_4a0;
                    uStack_498 = local_4a0;
                    uStack_494 = local_4a0;
                    uStack_490 = local_4a0;
                    uStack_48c = local_4a0;
                    uStack_488 = local_4a0;
                    uStack_484 = local_4a0;
                    local_480 = context->user->instPrimID[0];
                    uStack_47c = local_480;
                    uStack_478 = local_480;
                    uStack_474 = local_480;
                    uStack_470 = local_480;
                    uStack_46c = local_480;
                    uStack_468 = local_480;
                    uStack_464 = local_480;
                    *(float *)(ray + k * 4 + 0x100) = fVar126;
                    local_9a0 = local_720;
                    local_b10.valid = (int *)local_9a0;
                    local_b10.geometryUserPtr = pGVar2->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = (RTCHitN *)local_580;
                    local_b10.N = 8;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar2->occlusionFilterN)(&local_b10);
                      auVar270 = ZEXT3264(local_a80);
                      auVar140 = ZEXT816(0) << 0x40;
                    }
                    auVar85 = ZEXT1632(auVar140);
                    auVar84 = vpcmpeqd_avx2(local_9a0,auVar85);
                    auVar84 = _DAT_01f7b020 & ~auVar84;
                    if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar84 >> 0x7f,0) != '\0') ||
                          (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar84 >> 0xbf,0) != '\0') ||
                        (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar84[0x1f] < '\0') {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var3)(&local_b10);
                        auVar270 = ZEXT3264(local_a80);
                        auVar85 = ZEXT832(0) << 0x40;
                      }
                      auVar242 = ZEXT464((uint)fVar127);
                      auVar85 = vpcmpeqd_avx2(local_9a0,auVar85);
                      auVar123._8_4_ = 0xff800000;
                      auVar123._0_8_ = 0xff800000ff800000;
                      auVar123._12_4_ = 0xff800000;
                      auVar123._16_4_ = 0xff800000;
                      auVar123._20_4_ = 0xff800000;
                      auVar123._24_4_ = 0xff800000;
                      auVar123._28_4_ = 0xff800000;
                      auVar84 = vblendvps_avx(auVar123,*(undefined1 (*) [32])(local_b10.ray + 0x100)
                                              ,auVar85);
                      *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar84;
                      auVar84 = _DAT_01f7b020 & ~auVar85;
                      if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar84 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar84 >> 0x7f,0) != '\0') ||
                            (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar84 >> 0xbf,0) != '\0') ||
                          (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar84[0x1f] < '\0') {
                        bVar57 = 1;
                        goto LAB_0119c8e3;
                      }
                    }
                    auVar242 = ZEXT464((uint)fVar127);
                    *(float *)(ray + k * 4 + 0x100) = fVar127;
                  }
                }
              }
              bVar57 = 0;
              goto LAB_0119c8e3;
            }
          }
        }
        bVar68 = false;
LAB_0119c8e3:
        uVar66 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar231._4_4_ = uVar66;
        auVar231._0_4_ = uVar66;
        auVar231._8_4_ = uVar66;
        auVar231._12_4_ = uVar66;
        auVar231._16_4_ = uVar66;
        auVar231._20_4_ = uVar66;
        auVar231._24_4_ = uVar66;
        auVar231._28_4_ = uVar66;
        auVar232 = ZEXT3264(auVar231);
        bVar64 = bVar64 | bVar68 & bVar57;
        auVar84 = vcmpps_avx(_local_b60,auVar231,2);
      }
      auVar124._0_4_ = (float)local_940._0_4_ + local_5c0._0_4_;
      auVar124._4_4_ = (float)local_940._4_4_ + local_5c0._4_4_;
      auVar124._8_4_ = fStack_938 + local_5c0._8_4_;
      auVar124._12_4_ = fStack_934 + local_5c0._12_4_;
      auVar124._16_4_ = fStack_930 + local_5c0._16_4_;
      auVar124._20_4_ = fStack_92c + local_5c0._20_4_;
      auVar124._24_4_ = fStack_928 + local_5c0._24_4_;
      auVar124._28_4_ = fStack_924 + local_5c0._28_4_;
      uVar66 = auVar232._0_4_;
      auVar171._4_4_ = uVar66;
      auVar171._0_4_ = uVar66;
      auVar171._8_4_ = uVar66;
      auVar171._12_4_ = uVar66;
      auVar171._16_4_ = uVar66;
      auVar171._20_4_ = uVar66;
      auVar171._24_4_ = uVar66;
      auVar171._28_4_ = uVar66;
      auVar235 = vcmpps_avx(auVar124,auVar171,2);
      auVar84 = vandps_avx(local_780,local_760);
      auVar84 = vandps_avx(auVar235,auVar84);
      auVar183._0_4_ = (float)local_940._0_4_ + local_460._0_4_;
      auVar183._4_4_ = (float)local_940._4_4_ + local_460._4_4_;
      auVar183._8_4_ = fStack_938 + local_460._8_4_;
      auVar183._12_4_ = fStack_934 + local_460._12_4_;
      auVar183._16_4_ = fStack_930 + local_460._16_4_;
      auVar183._20_4_ = fStack_92c + local_460._20_4_;
      auVar183._24_4_ = fStack_928 + local_460._24_4_;
      auVar183._28_4_ = fStack_924 + local_460._28_4_;
      auVar85 = vcmpps_avx(auVar183,auVar171,2);
      auVar235 = vandps_avx(_local_920,_local_900);
      auVar235 = vandps_avx(auVar85,auVar235);
      auVar235 = vorps_avx(auVar84,auVar235);
      if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar235 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar235 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar235 >> 0x7f,0) != '\0') ||
            (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar235 >> 0xbf,0) != '\0') ||
          (auVar235 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar235[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar61 * 0x60) = auVar235;
        auVar84 = vblendvps_avx(_local_460,local_5c0,auVar84);
        *(undefined1 (*) [32])(auStack_160 + uVar61 * 0x60) = auVar84;
        uVar65 = vmovlps_avx(local_730);
        (&uStack_140)[uVar61 * 0xc] = uVar65;
        aiStack_138[uVar61 * 0x18] = local_ce4 + 1;
        uVar61 = (ulong)((int)uVar61 + 1);
      }
      auVar249 = ZEXT3264(CONCAT824(uStack_a08,CONCAT816(uStack_a10,CONCAT88(uStack_a18,local_a20)))
                         );
      auVar259 = ZEXT3264(local_9e0);
      fVar98 = (float)local_940._0_4_;
      fVar126 = (float)local_940._4_4_;
      fVar127 = fStack_938;
      fVar128 = fStack_934;
      fVar131 = fStack_930;
      fVar129 = fStack_92c;
      fVar130 = fStack_928;
      fVar197 = fStack_924;
    }
    while( true ) {
      uVar59 = (uint)uVar61;
      if (uVar59 == 0) {
        if (bVar64 != 0) goto LAB_0119cdf2;
        uVar66 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar83._4_4_ = uVar66;
        auVar83._0_4_ = uVar66;
        auVar83._8_4_ = uVar66;
        auVar83._12_4_ = uVar66;
        auVar4 = vcmpps_avx(local_740,auVar83,2);
        uVar60 = vmovmskps_avx(auVar4);
        local_948 = (ulong)((uint)local_950 & uVar60);
        goto LAB_0119a722;
      }
      uVar61 = (ulong)(uVar59 - 1);
      lVar62 = uVar61 * 0x60;
      auVar84 = *(undefined1 (*) [32])(auStack_160 + lVar62);
      auVar90._0_4_ = fVar98 + auVar84._0_4_;
      auVar90._4_4_ = fVar126 + auVar84._4_4_;
      auVar90._8_4_ = fVar127 + auVar84._8_4_;
      auVar90._12_4_ = fVar128 + auVar84._12_4_;
      auVar90._16_4_ = fVar131 + auVar84._16_4_;
      auVar90._20_4_ = fVar129 + auVar84._20_4_;
      auVar90._24_4_ = fVar130 + auVar84._24_4_;
      auVar90._28_4_ = fVar197 + auVar84._28_4_;
      uVar66 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar170._4_4_ = uVar66;
      auVar170._0_4_ = uVar66;
      auVar170._8_4_ = uVar66;
      auVar170._12_4_ = uVar66;
      auVar170._16_4_ = uVar66;
      auVar170._20_4_ = uVar66;
      auVar170._24_4_ = uVar66;
      auVar170._28_4_ = uVar66;
      auVar85 = vcmpps_avx(auVar90,auVar170,2);
      auVar235 = vandps_avx(auVar85,*(undefined1 (*) [32])(auStack_180 + lVar62));
      local_580 = auVar235;
      auVar85 = *(undefined1 (*) [32])(auStack_180 + lVar62) & auVar85;
      if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar85 >> 0x7f,0) != '\0') ||
            (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar85 >> 0xbf,0) != '\0') ||
          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar85[0x1f] < '\0') break;
      uVar61 = (ulong)(uVar59 - 1);
    }
    auVar142._8_4_ = 0x7f800000;
    auVar142._0_8_ = 0x7f8000007f800000;
    auVar142._12_4_ = 0x7f800000;
    auVar142._16_4_ = 0x7f800000;
    auVar142._20_4_ = 0x7f800000;
    auVar142._24_4_ = 0x7f800000;
    auVar142._28_4_ = 0x7f800000;
    auVar84 = vblendvps_avx(auVar142,auVar84,auVar235);
    auVar85 = vshufps_avx(auVar84,auVar84,0xb1);
    auVar85 = vminps_avx(auVar84,auVar85);
    auVar11 = vshufpd_avx(auVar85,auVar85,5);
    auVar85 = vminps_avx(auVar85,auVar11);
    auVar11 = vpermpd_avx2(auVar85,0x4e);
    auVar85 = vminps_avx(auVar85,auVar11);
    auVar84 = vcmpps_avx(auVar84,auVar85,0);
    auVar85 = auVar235 & auVar84;
    if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar85 >> 0x7f,0) != '\0') ||
          (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar85 >> 0xbf,0) != '\0') ||
        (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar85[0x1f] < '\0')
    {
      auVar235 = vandps_avx(auVar84,auVar235);
    }
    auVar224 = ZEXT3264(local_6a0);
    uVar63 = vmovmskps_avx(auVar235);
    iVar58 = 0;
    for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
      iVar58 = iVar58 + 1;
    }
    *(undefined4 *)(local_580 + (uint)(iVar58 << 2)) = 0;
    uVar65 = (&uStack_140)[uVar61 * 0xc];
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar65;
    local_ce4 = aiStack_138[uVar61 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar62) = local_580;
    uVar63 = uVar59 - 1;
    if ((((((((local_580 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_580 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_580 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_580 >> 0x7f,0) != '\0') ||
          (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_580 >> 0xbf,0) != '\0') ||
        (local_580 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_580[0x1f] < '\0') {
      uVar63 = uVar59;
    }
    uVar66 = (undefined4)uVar65;
    auVar116._4_4_ = uVar66;
    auVar116._0_4_ = uVar66;
    auVar116._8_4_ = uVar66;
    auVar116._12_4_ = uVar66;
    auVar116._16_4_ = uVar66;
    auVar116._20_4_ = uVar66;
    auVar116._24_4_ = uVar66;
    auVar116._28_4_ = uVar66;
    auVar8 = vmovshdup_avx(auVar75);
    auVar8 = vsubps_avx(auVar8,auVar75);
    auVar91._0_4_ = auVar8._0_4_;
    auVar91._4_4_ = auVar91._0_4_;
    auVar91._8_4_ = auVar91._0_4_;
    auVar91._12_4_ = auVar91._0_4_;
    auVar91._16_4_ = auVar91._0_4_;
    auVar91._20_4_ = auVar91._0_4_;
    auVar91._24_4_ = auVar91._0_4_;
    auVar91._28_4_ = auVar91._0_4_;
    auVar8 = vfmadd132ps_fma(auVar91,auVar116,_DAT_01f7b040);
    local_5c0 = ZEXT1632(auVar8);
    local_730._8_8_ = 0;
    local_730._0_8_ = *(ulong *)(local_5c0 + (uint)(iVar58 << 2));
    uVar61 = (ulong)uVar63;
    auVar235 = auVar270._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }